

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  int iVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  undefined8 uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  byte bVar58;
  uint uVar59;
  uint uVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  Geometry *pGVar64;
  ulong uVar65;
  long lVar66;
  byte bVar67;
  uint uVar68;
  ulong uVar69;
  float fVar70;
  float fVar71;
  float fVar132;
  float fVar134;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar133;
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar136;
  float fVar139;
  float fVar140;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined4 uVar141;
  vint4 bi_2;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined8 uVar149;
  vint4 bi_1;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  float fVar156;
  float fVar168;
  vint4 bi;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  vint4 ai;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [64];
  vint4 ai_1;
  undefined1 auVar190 [16];
  vint4 ai_2;
  undefined1 auVar191 [16];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  float fVar195;
  float fVar196;
  undefined1 auVar194 [16];
  float fVar197;
  float fVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_53c;
  long local_538;
  RayHit *local_530;
  ulong local_528;
  ulong local_520;
  ulong local_518;
  Primitive *local_510;
  Precalculations *local_508;
  RTCFilterFunctionNArguments local_500;
  undefined1 local_4d0 [8];
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined4 local_488;
  float local_484;
  undefined4 local_480;
  undefined4 local_47c;
  undefined4 local_478;
  uint local_474;
  uint local_470;
  Geometry *local_458;
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_508 = pre;
  uVar69 = (ulong)(byte)prim[1];
  lVar66 = uVar69 * 0x25;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xf + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x11 + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1a + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1b + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1c + 6)));
  fVar156 = *(float *)(prim + lVar66 + 0x12);
  auVar74 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar66 + 6));
  fVar195 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar66 + 0x16)) *
            *(float *)(prim + lVar66 + 0x1a);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar91 = vpmovsxwd_avx(auVar83);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar218 = vpmovsxwd_avx(auVar88);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar18 = vpmovsxwd_avx(auVar85);
  auVar72 = vpbroadcastd_avx512vl();
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar73 = vpmovsxwd_avx512vl(auVar84);
  auVar214._0_4_ = fVar156 * auVar74._0_4_;
  auVar214._4_4_ = fVar156 * auVar74._4_4_;
  auVar214._8_4_ = fVar156 * auVar74._8_4_;
  auVar214._12_4_ = fVar156 * auVar74._12_4_;
  auVar212._0_4_ = fVar156 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar212._4_4_ = fVar156 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar212._8_4_ = fVar156 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar212._12_4_ = fVar156 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar74 = vcvtdq2ps_avx512vl(auVar16);
  auVar75 = vcvtdq2ps_avx512vl(auVar80);
  auVar76 = vcvtdq2ps_avx512vl(auVar76);
  auVar77 = vcvtdq2ps_avx512vl(auVar77);
  auVar78 = vcvtdq2ps_avx512vl(auVar78);
  auVar83 = vcvtdq2ps_avx(auVar79);
  auVar88 = vcvtdq2ps_avx(auVar81);
  auVar85 = vcvtdq2ps_avx(auVar82);
  auVar84 = vcvtdq2ps_avx(auVar17);
  auVar199._4_4_ = auVar212._0_4_;
  auVar199._0_4_ = auVar212._0_4_;
  auVar199._8_4_ = auVar212._0_4_;
  auVar199._12_4_ = auVar212._0_4_;
  auVar16 = vshufps_avx(auVar212,auVar212,0x55);
  auVar80 = vshufps_avx(auVar212,auVar212,0xaa);
  auVar79 = vmulps_avx512vl(auVar80,auVar76);
  auVar87._0_4_ = auVar80._0_4_ * auVar83._0_4_;
  auVar87._4_4_ = auVar80._4_4_ * auVar83._4_4_;
  auVar87._8_4_ = auVar80._8_4_ * auVar83._8_4_;
  auVar87._12_4_ = auVar80._12_4_ * auVar83._12_4_;
  auVar86._0_4_ = auVar84._0_4_ * auVar80._0_4_;
  auVar86._4_4_ = auVar84._4_4_ * auVar80._4_4_;
  auVar86._8_4_ = auVar84._8_4_ * auVar80._8_4_;
  auVar86._12_4_ = auVar84._12_4_ * auVar80._12_4_;
  auVar80 = vfmadd231ps_avx512vl(auVar79,auVar16,auVar75);
  auVar79 = vfmadd231ps_avx512vl(auVar87,auVar16,auVar78);
  auVar16 = vfmadd231ps_fma(auVar86,auVar85,auVar16);
  auVar81 = vfmadd231ps_avx512vl(auVar80,auVar199,auVar74);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar199,auVar77);
  auVar80 = vfmadd231ps_fma(auVar16,auVar88,auVar199);
  auVar213._4_4_ = auVar214._0_4_;
  auVar213._0_4_ = auVar214._0_4_;
  auVar213._8_4_ = auVar214._0_4_;
  auVar213._12_4_ = auVar214._0_4_;
  auVar82 = vshufps_avx512vl(auVar214,auVar214,0x55);
  auVar16 = vshufps_avx(auVar214,auVar214,0xaa);
  auVar76 = vmulps_avx512vl(auVar16,auVar76);
  auVar200._0_4_ = auVar16._0_4_ * auVar83._0_4_;
  auVar200._4_4_ = auVar16._4_4_ * auVar83._4_4_;
  auVar200._8_4_ = auVar16._8_4_ * auVar83._8_4_;
  auVar200._12_4_ = auVar16._12_4_ * auVar83._12_4_;
  auVar169._0_4_ = auVar16._0_4_ * auVar84._0_4_;
  auVar169._4_4_ = auVar16._4_4_ * auVar84._4_4_;
  auVar169._8_4_ = auVar16._8_4_ * auVar84._8_4_;
  auVar169._12_4_ = auVar16._12_4_ * auVar84._12_4_;
  auVar83 = vfmadd231ps_avx512vl(auVar76,auVar82,auVar75);
  auVar84 = vfmadd231ps_avx512vl(auVar200,auVar82,auVar78);
  auVar85 = vfmadd231ps_avx512vl(auVar169,auVar82,auVar85);
  auVar86 = vfmadd231ps_avx512vl(auVar83,auVar213,auVar74);
  auVar87 = vfmadd231ps_avx512vl(auVar84,auVar213,auVar77);
  auVar75 = vfmadd231ps_fma(auVar85,auVar213,auVar88);
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar219 = ZEXT1664(auVar83);
  auVar88 = vandps_avx512vl(auVar81,auVar83);
  auVar207._8_4_ = 0x219392ef;
  auVar207._0_8_ = 0x219392ef219392ef;
  auVar207._12_4_ = 0x219392ef;
  uVar65 = vcmpps_avx512vl(auVar88,auVar207,1);
  bVar10 = (bool)((byte)uVar65 & 1);
  auVar74._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar81._0_4_;
  bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar81._4_4_;
  bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar81._8_4_;
  bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar81._12_4_;
  auVar88 = vandps_avx512vl(auVar79,auVar83);
  uVar65 = vcmpps_avx512vl(auVar88,auVar207,1);
  bVar10 = (bool)((byte)uVar65 & 1);
  auVar89._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar79._0_4_;
  bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar79._4_4_;
  bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar79._8_4_;
  bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar79._12_4_;
  auVar83 = vandps_avx512vl(auVar80,auVar83);
  uVar65 = vcmpps_avx512vl(auVar83,auVar207,1);
  bVar10 = (bool)((byte)uVar65 & 1);
  auVar90._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._0_4_;
  bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._4_4_;
  bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._8_4_;
  bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._12_4_;
  auVar88 = vrcp14ps_avx512vl(auVar74);
  auVar208._8_4_ = 0x3f800000;
  auVar208._0_8_ = 0x3f8000003f800000;
  auVar208._12_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar74,auVar88,auVar208);
  auVar84 = vfmadd132ps_fma(auVar83,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar89);
  auVar83 = vfnmadd213ps_fma(auVar89,auVar88,auVar208);
  auVar17 = vfmadd132ps_fma(auVar83,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar90);
  auVar83 = vfnmadd213ps_fma(auVar90,auVar88,auVar208);
  auVar74 = vfmadd132ps_fma(auVar83,auVar88,auVar88);
  auVar187._4_4_ = fVar195;
  auVar187._0_4_ = fVar195;
  auVar187._8_4_ = fVar195;
  auVar187._12_4_ = fVar195;
  auVar83 = vcvtdq2ps_avx(auVar91);
  auVar88 = vcvtdq2ps_avx(auVar218);
  auVar88 = vsubps_avx(auVar88,auVar83);
  auVar91 = vfmadd213ps_fma(auVar88,auVar187,auVar83);
  auVar83 = vcvtdq2ps_avx(auVar18);
  auVar88 = vcvtdq2ps_avx512vl(auVar73);
  auVar88 = vsubps_avx(auVar88,auVar83);
  auVar218 = vfmadd213ps_fma(auVar88,auVar187,auVar83);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar83 = vpmovsxwd_avx(auVar16);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar69 * 0x16 + 6);
  auVar88 = vpmovsxwd_avx(auVar80);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar85 = vsubps_avx(auVar88,auVar83);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar69 * 0x14 + 6);
  auVar88 = vpmovsxwd_avx(auVar76);
  auVar85 = vfmadd213ps_fma(auVar85,auVar187,auVar83);
  auVar83 = vcvtdq2ps_avx(auVar88);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar69 * 0x18 + 6);
  auVar88 = vpmovsxwd_avx(auVar77);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar83);
  auVar16 = vfmadd213ps_fma(auVar88,auVar187,auVar83);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar69 * 0x1d + 6);
  auVar83 = vpmovsxwd_avx(auVar78);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar69 * 0x21 + 6);
  auVar88 = vpmovsxwd_avx(auVar79);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar83);
  auVar80 = vfmadd213ps_fma(auVar88,auVar187,auVar83);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar69 * 0x1f + 6);
  auVar83 = vpmovsxwd_avx(auVar81);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar69 * 0x23 + 6);
  auVar88 = vpmovsxwd_avx(auVar82);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar83);
  auVar88 = vfmadd213ps_fma(auVar88,auVar187,auVar83);
  auVar83 = vsubps_avx(auVar91,auVar86);
  auVar188._0_4_ = auVar84._0_4_ * auVar83._0_4_;
  auVar188._4_4_ = auVar84._4_4_ * auVar83._4_4_;
  auVar188._8_4_ = auVar84._8_4_ * auVar83._8_4_;
  auVar188._12_4_ = auVar84._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar218,auVar86);
  auVar157._0_4_ = auVar84._0_4_ * auVar83._0_4_;
  auVar157._4_4_ = auVar84._4_4_ * auVar83._4_4_;
  auVar157._8_4_ = auVar84._8_4_ * auVar83._8_4_;
  auVar157._12_4_ = auVar84._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar85,auVar87);
  auVar190._0_4_ = auVar17._0_4_ * auVar83._0_4_;
  auVar190._4_4_ = auVar17._4_4_ * auVar83._4_4_;
  auVar190._8_4_ = auVar17._8_4_ * auVar83._8_4_;
  auVar190._12_4_ = auVar17._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar16,auVar87);
  auVar73._0_4_ = auVar17._0_4_ * auVar83._0_4_;
  auVar73._4_4_ = auVar17._4_4_ * auVar83._4_4_;
  auVar73._8_4_ = auVar17._8_4_ * auVar83._8_4_;
  auVar73._12_4_ = auVar17._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar80,auVar75);
  auVar191._0_4_ = auVar74._0_4_ * auVar83._0_4_;
  auVar191._4_4_ = auVar74._4_4_ * auVar83._4_4_;
  auVar191._8_4_ = auVar74._8_4_ * auVar83._8_4_;
  auVar191._12_4_ = auVar74._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar88,auVar75);
  auVar75._0_4_ = auVar74._0_4_ * auVar83._0_4_;
  auVar75._4_4_ = auVar74._4_4_ * auVar83._4_4_;
  auVar75._8_4_ = auVar74._8_4_ * auVar83._8_4_;
  auVar75._12_4_ = auVar74._12_4_ * auVar83._12_4_;
  auVar83 = vpminsd_avx(auVar188,auVar157);
  auVar88 = vpminsd_avx(auVar190,auVar73);
  auVar83 = vmaxps_avx(auVar83,auVar88);
  auVar88 = vpminsd_avx(auVar191,auVar75);
  uVar141 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar17._4_4_ = uVar141;
  auVar17._0_4_ = uVar141;
  auVar17._8_4_ = uVar141;
  auVar17._12_4_ = uVar141;
  auVar88 = vmaxps_avx512vl(auVar88,auVar17);
  auVar83 = vmaxps_avx(auVar83,auVar88);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  local_450 = vmulps_avx512vl(auVar83,auVar91);
  auVar220 = ZEXT1664(local_450);
  auVar83 = vpmaxsd_avx(auVar188,auVar157);
  auVar88 = vpmaxsd_avx(auVar190,auVar73);
  auVar83 = vminps_avx(auVar83,auVar88);
  auVar88 = vpmaxsd_avx(auVar191,auVar75);
  fVar156 = (ray->super_RayK<1>).tfar;
  auVar218._4_4_ = fVar156;
  auVar218._0_4_ = fVar156;
  auVar218._8_4_ = fVar156;
  auVar218._12_4_ = fVar156;
  auVar88 = vminps_avx512vl(auVar88,auVar218);
  auVar83 = vminps_avx(auVar83,auVar88);
  auVar18._8_4_ = 0x3f800003;
  auVar18._0_8_ = 0x3f8000033f800003;
  auVar18._12_4_ = 0x3f800003;
  auVar83 = vmulps_avx512vl(auVar83,auVar18);
  uVar149 = vcmpps_avx512vl(local_450,auVar83,2);
  uVar20 = vpcmpgtd_avx512vl(auVar72,_DAT_01f4ad30);
  local_520 = (ulong)((byte)uVar149 & 0xf & (byte)uVar20);
  local_510 = prim;
  local_530 = ray;
  do {
    if (local_520 == 0) {
      return;
    }
    lVar66 = 0;
    for (uVar65 = local_520; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
      lVar66 = lVar66 + 1;
    }
    uVar68 = *(uint *)(prim + 2);
    uVar60 = *(uint *)(prim + lVar66 * 4 + 6);
    local_528 = (ulong)uVar68;
    pGVar64 = (context->scene->geometries).items[uVar68].ptr;
    local_518 = (ulong)uVar60;
    uVar65 = (ulong)*(uint *)(*(long *)&pGVar64->field_0x58 +
                             (ulong)uVar60 *
                             pGVar64[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar156 = (pGVar64->time_range).lower;
    fVar156 = pGVar64->fnumTimeSegments *
              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar156) /
              ((pGVar64->time_range).upper - fVar156));
    auVar83 = vroundss_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),9);
    auVar83 = vminss_avx(auVar83,ZEXT416((uint)(pGVar64->fnumTimeSegments + -1.0)));
    auVar83 = vmaxss_avx(ZEXT816(0) << 0x20,auVar83);
    fVar156 = fVar156 - auVar83._0_4_;
    _Var8 = pGVar64[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar62 = (long)(int)auVar83._0_4_ * 0x38;
    lVar66 = *(long *)(_Var8 + 0x10 + lVar62);
    lVar61 = *(long *)(_Var8 + 0x38 + lVar62);
    lVar63 = *(long *)(_Var8 + 0x48 + lVar62);
    auVar150._4_4_ = fVar156;
    auVar150._0_4_ = fVar156;
    auVar150._8_4_ = fVar156;
    auVar150._12_4_ = fVar156;
    pfVar3 = (float *)(lVar61 + uVar65 * lVar63);
    auVar209._0_4_ = fVar156 * *pfVar3;
    auVar209._4_4_ = fVar156 * pfVar3[1];
    auVar209._8_4_ = fVar156 * pfVar3[2];
    auVar209._12_4_ = fVar156 * pfVar3[3];
    pfVar3 = (float *)(lVar61 + (uVar65 + 1) * lVar63);
    auVar211._0_4_ = fVar156 * *pfVar3;
    auVar211._4_4_ = fVar156 * pfVar3[1];
    auVar211._8_4_ = fVar156 * pfVar3[2];
    auVar211._12_4_ = fVar156 * pfVar3[3];
    auVar83 = vmulps_avx512vl(auVar150,*(undefined1 (*) [16])(lVar61 + (uVar65 + 2) * lVar63));
    auVar88 = vmulps_avx512vl(auVar150,*(undefined1 (*) [16])(lVar61 + lVar63 * (uVar65 + 3)));
    lVar61 = *(long *)(_Var8 + lVar62);
    fVar156 = 1.0 - fVar156;
    auVar72._4_4_ = fVar156;
    auVar72._0_4_ = fVar156;
    auVar72._8_4_ = fVar156;
    auVar72._12_4_ = fVar156;
    local_4a0 = vfmadd231ps_fma(auVar209,auVar72,*(undefined1 (*) [16])(lVar61 + lVar66 * uVar65));
    local_4b0 = vfmadd231ps_fma(auVar211,auVar72,
                                *(undefined1 (*) [16])(lVar61 + lVar66 * (uVar65 + 1)));
    local_4c0 = vfmadd231ps_avx512vl
                          (auVar83,auVar72,*(undefined1 (*) [16])(lVar61 + lVar66 * (uVar65 + 2)));
    _local_4d0 = vfmadd231ps_avx512vl
                           (auVar88,auVar72,*(undefined1 (*) [16])(lVar61 + lVar66 * (uVar65 + 3)));
    iVar7 = (int)pGVar64[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar4 = (local_530->super_RayK<1>).org.field_0;
    auVar88 = vsubps_avx(local_4a0,(undefined1  [16])aVar4);
    uVar141 = auVar88._0_4_;
    auVar151._4_4_ = uVar141;
    auVar151._0_4_ = uVar141;
    auVar151._8_4_ = uVar141;
    auVar151._12_4_ = uVar141;
    auVar83 = vshufps_avx(auVar88,auVar88,0x55);
    aVar5 = (local_508->ray_space).vx.field_0;
    aVar6 = (local_508->ray_space).vy.field_0;
    fVar156 = (local_508->ray_space).vz.field_0.m128[0];
    fVar195 = (local_508->ray_space).vz.field_0.m128[1];
    fVar196 = (local_508->ray_space).vz.field_0.m128[2];
    fVar197 = (local_508->ray_space).vz.field_0.m128[3];
    auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
    auVar194._0_4_ = auVar88._0_4_ * fVar156;
    auVar194._4_4_ = auVar88._4_4_ * fVar195;
    auVar194._8_4_ = auVar88._8_4_ * fVar196;
    auVar194._12_4_ = auVar88._12_4_ * fVar197;
    auVar83 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar6,auVar83);
    auVar85 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar5,auVar151);
    auVar88 = vsubps_avx(local_4b0,(undefined1  [16])aVar4);
    uVar141 = auVar88._0_4_;
    auVar152._4_4_ = uVar141;
    auVar152._0_4_ = uVar141;
    auVar152._8_4_ = uVar141;
    auVar152._12_4_ = uVar141;
    auVar83 = vshufps_avx(auVar88,auVar88,0x55);
    auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
    auVar201._0_4_ = auVar88._0_4_ * fVar156;
    auVar201._4_4_ = auVar88._4_4_ * fVar195;
    auVar201._8_4_ = auVar88._8_4_ * fVar196;
    auVar201._12_4_ = auVar88._12_4_ * fVar197;
    auVar83 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar6,auVar83);
    auVar84 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar5,auVar152);
    auVar88 = vsubps_avx512vl(local_4c0,(undefined1  [16])aVar4);
    uVar141 = auVar88._0_4_;
    auVar153._4_4_ = uVar141;
    auVar153._0_4_ = uVar141;
    auVar153._8_4_ = uVar141;
    auVar153._12_4_ = uVar141;
    auVar83 = vshufps_avx(auVar88,auVar88,0x55);
    auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
    auVar204._0_4_ = auVar88._0_4_ * fVar156;
    auVar204._4_4_ = auVar88._4_4_ * fVar195;
    auVar204._8_4_ = auVar88._8_4_ * fVar196;
    auVar204._12_4_ = auVar88._12_4_ * fVar197;
    auVar83 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar6,auVar83);
    auVar16 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar5,auVar153);
    local_3a0 = ZEXT1632((undefined1  [16])aVar4);
    auVar88 = vsubps_avx512vl(_local_4d0,(undefined1  [16])aVar4);
    uVar141 = auVar88._0_4_;
    auVar154._4_4_ = uVar141;
    auVar154._0_4_ = uVar141;
    auVar154._8_4_ = uVar141;
    auVar154._12_4_ = uVar141;
    auVar83 = vshufps_avx(auVar88,auVar88,0x55);
    auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
    auVar205._0_4_ = auVar88._0_4_ * fVar156;
    auVar205._4_4_ = auVar88._4_4_ * fVar195;
    auVar205._8_4_ = auVar88._8_4_ * fVar196;
    auVar205._12_4_ = auVar88._12_4_ * fVar197;
    auVar83 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar6,auVar83);
    auVar80 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar5,auVar154);
    local_538 = (long)iVar7;
    lVar66 = local_538 * 0x44;
    auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar66);
    uVar141 = auVar85._0_4_;
    local_2a0._4_4_ = uVar141;
    local_2a0._0_4_ = uVar141;
    local_2a0._8_4_ = uVar141;
    local_2a0._12_4_ = uVar141;
    local_2a0._16_4_ = uVar141;
    local_2a0._20_4_ = uVar141;
    local_2a0._24_4_ = uVar141;
    local_2a0._28_4_ = uVar141;
    auVar92._8_4_ = 1;
    auVar92._0_8_ = 0x100000001;
    auVar92._12_4_ = 1;
    auVar92._16_4_ = 1;
    auVar92._20_4_ = 1;
    auVar92._24_4_ = 1;
    auVar92._28_4_ = 1;
    local_2c0 = vpermps_avx2(auVar92,ZEXT1632(auVar85));
    auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar66 + 0x484);
    uVar141 = auVar84._0_4_;
    auVar170._4_4_ = uVar141;
    auVar170._0_4_ = uVar141;
    auVar170._8_4_ = uVar141;
    auVar170._12_4_ = uVar141;
    local_2e0._16_4_ = uVar141;
    local_2e0._0_16_ = auVar170;
    local_2e0._20_4_ = uVar141;
    local_2e0._24_4_ = uVar141;
    local_2e0._28_4_ = uVar141;
    auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar66 + 0x908);
    local_300 = vpermps_avx512vl(auVar92,ZEXT1632(auVar84));
    local_320 = vbroadcastss_avx512vl(auVar16);
    local_340 = vpermps_avx512vl(auVar92,ZEXT1632(auVar16));
    auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar66 + 0xd8c);
    fVar156 = auVar80._0_4_;
    local_360._4_4_ = fVar156;
    local_360._0_4_ = fVar156;
    fStack_358 = fVar156;
    fStack_354 = fVar156;
    fStack_350 = fVar156;
    fStack_34c = fVar156;
    fStack_348 = fVar156;
    register0x0000139c = fVar156;
    _local_380 = vpermps_avx512vl(auVar92,ZEXT1632(auVar80));
    auVar92 = vmulps_avx512vl(_local_360,auVar104);
    auVar93 = vmulps_avx512vl(_local_380,auVar104);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_320);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar105,local_340);
    auVar83 = vfmadd231ps_fma(auVar92,auVar107,local_2e0);
    auVar94 = vfmadd231ps_avx512vl(auVar93,auVar107,local_300);
    auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar106,local_2a0);
    auVar189 = ZEXT3264(auVar95);
    auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar66);
    auVar93 = *(undefined1 (*) [32])(bspline_basis1 + lVar66 + 0x484);
    auVar96 = vfmadd231ps_avx512vl(auVar94,auVar106,local_2c0);
    auVar186 = ZEXT3264(auVar96);
    auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar66 + 0x908);
    auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar66 + 0xd8c);
    auVar97 = vmulps_avx512vl(_local_360,auVar103);
    auVar98 = vmulps_avx512vl(_local_380,auVar103);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_320);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_340);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_2e0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_300);
    auVar76 = vfmadd231ps_fma(auVar97,auVar92,local_2a0);
    auVar192 = ZEXT1664(auVar76);
    auVar77 = vfmadd231ps_fma(auVar98,auVar92,local_2c0);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar76),auVar95);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar77),auVar96);
    auVar97 = vmulps_avx512vl(auVar96,auVar98);
    auVar100 = vmulps_avx512vl(auVar95,auVar99);
    auVar97 = vsubps_avx512vl(auVar97,auVar100);
    auVar83 = vshufps_avx(local_4a0,local_4a0,0xff);
    uVar149 = auVar83._0_8_;
    local_80._8_8_ = uVar149;
    local_80._0_8_ = uVar149;
    local_80._16_8_ = uVar149;
    local_80._24_8_ = uVar149;
    auVar83 = vshufps_avx(local_4b0,local_4b0,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar83);
    auVar83 = vshufps_avx512vl(local_4c0,local_4c0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar83);
    auVar83 = vshufps_avx512vl(_local_4d0,_local_4d0,0xff);
    uVar149 = auVar83._0_8_;
    local_e0._8_8_ = uVar149;
    local_e0._0_8_ = uVar149;
    local_e0._16_8_ = uVar149;
    local_e0._24_8_ = uVar149;
    auVar100 = vmulps_avx512vl(local_e0,auVar104);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_c0);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_a0);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_80);
    auVar101 = vmulps_avx512vl(local_e0,auVar103);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar94,local_c0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,local_a0);
    auVar78 = vfmadd231ps_fma(auVar101,auVar92,local_80);
    auVar101 = vmulps_avx512vl(auVar99,auVar99);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar98);
    auVar102 = vmaxps_avx512vl(auVar100,ZEXT1632(auVar78));
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    auVar101 = vmulps_avx512vl(auVar102,auVar101);
    auVar97 = vmulps_avx512vl(auVar97,auVar97);
    uVar149 = vcmpps_avx512vl(auVar97,auVar101,2);
    auVar17 = local_4a0;
    auVar83 = vblendps_avx(auVar85,local_4a0,8);
    auVar218 = auVar219._0_16_;
    auVar88 = vandps_avx512vl(auVar83,auVar218);
    auVar82 = local_4b0;
    auVar83 = vblendps_avx(auVar84,local_4b0,8);
    auVar83 = vandps_avx512vl(auVar83,auVar218);
    auVar88 = vmaxps_avx(auVar88,auVar83);
    auVar81 = local_4c0;
    auVar83 = vblendps_avx(auVar16,local_4c0,8);
    auVar91 = vandps_avx512vl(auVar83,auVar218);
    auVar79 = _local_4d0;
    auVar83 = vblendps_avx(auVar80,_local_4d0,8);
    auVar83 = vandps_avx512vl(auVar83,auVar218);
    auVar83 = vmaxps_avx(auVar91,auVar83);
    auVar83 = vmaxps_avx(auVar88,auVar83);
    auVar88 = vmovshdup_avx(auVar83);
    auVar88 = vmaxss_avx(auVar88,auVar83);
    auVar83 = vshufpd_avx(auVar83,auVar83,1);
    auVar83 = vmaxss_avx(auVar83,auVar88);
    auVar88 = vcvtsi2ss_avx512f(auVar218,iVar7);
    local_420._0_16_ = auVar88;
    auVar210._0_4_ = auVar88._0_4_;
    auVar210._4_4_ = auVar210._0_4_;
    auVar210._8_4_ = auVar210._0_4_;
    auVar210._12_4_ = auVar210._0_4_;
    auVar210._16_4_ = auVar210._0_4_;
    auVar210._20_4_ = auVar210._0_4_;
    auVar210._24_4_ = auVar210._0_4_;
    auVar210._28_4_ = auVar210._0_4_;
    uVar20 = vcmpps_avx512vl(auVar210,_DAT_01f7b060,0xe);
    bVar67 = (byte)uVar149 & (byte)uVar20;
    auVar83 = vmulss_avx512f(auVar83,SUB6416(ZEXT464(0x35000000),0));
    local_400._0_16_ = auVar83;
    auVar97 = local_400;
    auVar102._8_4_ = 2;
    auVar102._0_8_ = 0x200000002;
    auVar102._12_4_ = 2;
    auVar102._16_4_ = 2;
    auVar102._20_4_ = 2;
    auVar102._24_4_ = 2;
    auVar102._28_4_ = 2;
    auVar101 = vpermps_avx512vl(auVar102,ZEXT1632(auVar85));
    local_120 = vpermps_avx2(auVar102,ZEXT1632(auVar84));
    local_140 = vpermps_avx2(auVar102,ZEXT1632(auVar16));
    local_160 = vpermps_avx2(auVar102,ZEXT1632(auVar80));
    ray = local_530;
    _local_4d0 = auVar79;
    local_4c0 = auVar81;
    local_4b0 = auVar82;
    local_4a0 = auVar17;
    local_400 = auVar97;
    if (bVar67 != 0) {
      auVar103 = vmulps_avx512vl(local_160,auVar103);
      auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar103);
      auVar93 = vfmadd213ps_avx512vl(auVar93,local_120,auVar94);
      auVar97 = vfmadd213ps_avx512vl(auVar92,auVar101,auVar93);
      auVar104 = vmulps_avx512vl(local_160,auVar104);
      auVar105 = vfmadd213ps_avx512vl(auVar105,local_140,auVar104);
      auVar93 = vfmadd213ps_avx512vl(auVar107,local_120,auVar105);
      auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar66 + 0x1210);
      auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar66 + 0x1694);
      auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar66 + 0x1b18);
      auVar92 = *(undefined1 (*) [32])(bspline_basis0 + lVar66 + 0x1f9c);
      auVar102 = vfmadd213ps_avx512vl(auVar106,auVar101,auVar93);
      auVar202._0_4_ = fVar156 * auVar92._0_4_;
      auVar202._4_4_ = fVar156 * auVar92._4_4_;
      auVar202._8_4_ = fVar156 * auVar92._8_4_;
      auVar202._12_4_ = fVar156 * auVar92._12_4_;
      auVar202._16_4_ = fVar156 * auVar92._16_4_;
      auVar202._20_4_ = fVar156 * auVar92._20_4_;
      auVar202._24_4_ = fVar156 * auVar92._24_4_;
      auVar202._28_4_ = 0;
      auVar106 = vmulps_avx512vl(_local_380,auVar92);
      auVar92 = vmulps_avx512vl(local_160,auVar92);
      auVar93 = vfmadd231ps_avx512vl(auVar202,auVar104,local_320);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,local_340);
      auVar104 = vfmadd231ps_avx512vl(auVar92,local_140,auVar104);
      auVar92 = vfmadd231ps_avx512vl(auVar93,auVar105,local_2e0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar105,local_300);
      auVar93 = vfmadd231ps_avx512vl(auVar104,local_120,auVar105);
      auVar88 = vfmadd231ps_fma(auVar92,auVar107,local_2a0);
      auVar92 = vfmadd231ps_avx512vl(auVar106,auVar107,local_2c0);
      auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar66 + 0x1210);
      auVar105 = *(undefined1 (*) [32])(bspline_basis1 + lVar66 + 0x1b18);
      auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar66 + 0x1f9c);
      auVar94 = vfmadd231ps_avx512vl(auVar93,auVar101,auVar107);
      auVar93._4_4_ = fVar156 * auVar104._4_4_;
      auVar93._0_4_ = fVar156 * auVar104._0_4_;
      auVar93._8_4_ = fVar156 * auVar104._8_4_;
      auVar93._12_4_ = fVar156 * auVar104._12_4_;
      auVar93._16_4_ = fVar156 * auVar104._16_4_;
      auVar93._20_4_ = fVar156 * auVar104._20_4_;
      auVar93._24_4_ = fVar156 * auVar104._24_4_;
      auVar93._28_4_ = auVar107._28_4_;
      auVar107 = vmulps_avx512vl(_local_380,auVar104);
      auVar104 = vmulps_avx512vl(local_160,auVar104);
      auVar219 = ZEXT1664(auVar218);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar105,local_320);
      auVar103 = vfmadd231ps_avx512vl(auVar107,auVar105,local_340);
      auVar217 = ZEXT3264(auVar101);
      auVar105 = vfmadd231ps_avx512vl(auVar104,local_140,auVar105);
      auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar66 + 0x1694);
      auVar104 = vfmadd231ps_avx512vl(auVar93,auVar107,local_2e0);
      auVar93 = vfmadd231ps_avx512vl(auVar103,auVar107,local_300);
      auVar107 = vfmadd231ps_avx512vl(auVar105,local_120,auVar107);
      auVar85 = vfmadd231ps_fma(auVar104,auVar106,local_2a0);
      auVar105 = vfmadd231ps_avx512vl(auVar93,auVar106,local_2c0);
      auVar104 = vfmadd231ps_avx512vl(auVar107,auVar101,auVar106);
      auVar215._8_4_ = 0x7fffffff;
      auVar215._0_8_ = 0x7fffffff7fffffff;
      auVar215._12_4_ = 0x7fffffff;
      auVar215._16_4_ = 0x7fffffff;
      auVar215._20_4_ = 0x7fffffff;
      auVar215._24_4_ = 0x7fffffff;
      auVar215._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(ZEXT1632(auVar88),auVar215);
      auVar107 = vandps_avx(auVar92,auVar215);
      auVar107 = vmaxps_avx(auVar106,auVar107);
      auVar106 = vandps_avx(auVar94,auVar215);
      auVar106 = vmaxps_avx(auVar107,auVar106);
      local_400._0_4_ = auVar83._0_4_;
      auVar206._4_4_ = local_400._0_4_;
      auVar206._0_4_ = local_400._0_4_;
      auVar206._8_4_ = local_400._0_4_;
      auVar206._12_4_ = local_400._0_4_;
      auVar206._16_4_ = local_400._0_4_;
      auVar206._20_4_ = local_400._0_4_;
      auVar206._24_4_ = local_400._0_4_;
      auVar206._28_4_ = local_400._0_4_;
      uVar65 = vcmpps_avx512vl(auVar106,auVar206,1);
      bVar10 = (bool)((byte)uVar65 & 1);
      auVar108._0_4_ = (float)((uint)bVar10 * auVar98._0_4_ | (uint)!bVar10 * auVar88._0_4_);
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar10 * auVar98._4_4_ | (uint)!bVar10 * auVar88._4_4_);
      bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar10 * auVar98._8_4_ | (uint)!bVar10 * auVar88._8_4_);
      bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar10 * auVar98._12_4_ | (uint)!bVar10 * auVar88._12_4_);
      fVar195 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar98._16_4_);
      auVar108._16_4_ = fVar195;
      fVar156 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar98._20_4_);
      auVar108._20_4_ = fVar156;
      fVar196 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar98._24_4_);
      auVar108._24_4_ = fVar196;
      uVar59 = (uint)(byte)(uVar65 >> 7) * auVar98._28_4_;
      auVar108._28_4_ = uVar59;
      bVar10 = (bool)((byte)uVar65 & 1);
      auVar109._0_4_ = (float)((uint)bVar10 * auVar99._0_4_ | (uint)!bVar10 * auVar92._0_4_);
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar10 * auVar99._4_4_ | (uint)!bVar10 * auVar92._4_4_);
      bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar10 * auVar99._8_4_ | (uint)!bVar10 * auVar92._8_4_);
      bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar10 * auVar99._12_4_ | (uint)!bVar10 * auVar92._12_4_);
      bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar109._16_4_ = (float)((uint)bVar10 * auVar99._16_4_ | (uint)!bVar10 * auVar92._16_4_);
      bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar109._20_4_ = (float)((uint)bVar10 * auVar99._20_4_ | (uint)!bVar10 * auVar92._20_4_);
      bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar109._24_4_ = (float)((uint)bVar10 * auVar99._24_4_ | (uint)!bVar10 * auVar92._24_4_);
      bVar10 = SUB81(uVar65 >> 7,0);
      auVar109._28_4_ = (uint)bVar10 * auVar99._28_4_ | (uint)!bVar10 * auVar92._28_4_;
      auVar106 = vandps_avx(auVar215,ZEXT1632(auVar85));
      auVar107 = vandps_avx(auVar105,auVar215);
      auVar107 = vmaxps_avx(auVar106,auVar107);
      auVar106 = vandps_avx(auVar104,auVar215);
      auVar106 = vmaxps_avx(auVar107,auVar106);
      uVar65 = vcmpps_avx512vl(auVar106,auVar206,1);
      bVar10 = (bool)((byte)uVar65 & 1);
      auVar110._0_4_ = (float)((uint)bVar10 * auVar98._0_4_ | (uint)!bVar10 * auVar85._0_4_);
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar10 * auVar98._4_4_ | (uint)!bVar10 * auVar85._4_4_);
      bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar10 * auVar98._8_4_ | (uint)!bVar10 * auVar85._8_4_);
      bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar10 * auVar98._12_4_ | (uint)!bVar10 * auVar85._12_4_);
      fVar197 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar98._16_4_);
      auVar110._16_4_ = fVar197;
      fVar198 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar98._20_4_);
      auVar110._20_4_ = fVar198;
      fVar168 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar98._24_4_);
      auVar110._24_4_ = fVar168;
      auVar110._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar98._28_4_;
      bVar10 = (bool)((byte)uVar65 & 1);
      auVar111._0_4_ = (float)((uint)bVar10 * auVar99._0_4_ | (uint)!bVar10 * auVar105._0_4_);
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar10 * auVar99._4_4_ | (uint)!bVar10 * auVar105._4_4_);
      bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar10 * auVar99._8_4_ | (uint)!bVar10 * auVar105._8_4_);
      bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar10 * auVar99._12_4_ | (uint)!bVar10 * auVar105._12_4_);
      bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar10 * auVar99._16_4_ | (uint)!bVar10 * auVar105._16_4_);
      bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar10 * auVar99._20_4_ | (uint)!bVar10 * auVar105._20_4_);
      bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar10 * auVar99._24_4_ | (uint)!bVar10 * auVar105._24_4_);
      bVar10 = SUB81(uVar65 >> 7,0);
      auVar111._28_4_ = (uint)bVar10 * auVar99._28_4_ | (uint)!bVar10 * auVar105._28_4_;
      auVar74 = vxorps_avx512vl(auVar170,auVar170);
      auVar106 = vfmadd213ps_avx512vl(auVar108,auVar108,ZEXT1632(auVar74));
      auVar83 = vfmadd231ps_fma(auVar106,auVar109,auVar109);
      auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar70 = auVar105._0_4_;
      fVar71 = auVar105._4_4_;
      fVar132 = auVar105._8_4_;
      fVar133 = auVar105._12_4_;
      fVar134 = auVar105._16_4_;
      fVar135 = auVar105._20_4_;
      fVar137 = auVar105._24_4_;
      auVar106._4_4_ = fVar71 * fVar71 * fVar71 * auVar83._4_4_ * -0.5;
      auVar106._0_4_ = fVar70 * fVar70 * fVar70 * auVar83._0_4_ * -0.5;
      auVar106._8_4_ = fVar132 * fVar132 * fVar132 * auVar83._8_4_ * -0.5;
      auVar106._12_4_ = fVar133 * fVar133 * fVar133 * auVar83._12_4_ * -0.5;
      auVar106._16_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar106._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar106._24_4_ = fVar137 * fVar137 * fVar137 * -0.0;
      auVar106._28_4_ = 0;
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar92,auVar105);
      auVar107._4_4_ = auVar109._4_4_ * auVar106._4_4_;
      auVar107._0_4_ = auVar109._0_4_ * auVar106._0_4_;
      auVar107._8_4_ = auVar109._8_4_ * auVar106._8_4_;
      auVar107._12_4_ = auVar109._12_4_ * auVar106._12_4_;
      auVar107._16_4_ = auVar109._16_4_ * auVar106._16_4_;
      auVar107._20_4_ = auVar109._20_4_ * auVar106._20_4_;
      auVar107._24_4_ = auVar109._24_4_ * auVar106._24_4_;
      auVar107._28_4_ = auVar105._28_4_;
      auVar105._4_4_ = auVar106._4_4_ * -auVar108._4_4_;
      auVar105._0_4_ = auVar106._0_4_ * -auVar108._0_4_;
      auVar105._8_4_ = auVar106._8_4_ * -auVar108._8_4_;
      auVar105._12_4_ = auVar106._12_4_ * -auVar108._12_4_;
      auVar105._16_4_ = auVar106._16_4_ * -fVar195;
      auVar105._20_4_ = auVar106._20_4_ * -fVar156;
      auVar105._24_4_ = auVar106._24_4_ * -fVar196;
      auVar105._28_4_ = uVar59 ^ 0x80000000;
      auVar93 = vmulps_avx512vl(auVar106,ZEXT1632(auVar74));
      auVar98 = ZEXT1632(auVar74);
      auVar104 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar98);
      auVar83 = vfmadd231ps_fma(auVar104,auVar111,auVar111);
      auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar156 = auVar103._0_4_;
      fVar195 = auVar103._4_4_;
      fVar196 = auVar103._8_4_;
      fVar70 = auVar103._12_4_;
      fVar71 = auVar103._16_4_;
      fVar132 = auVar103._20_4_;
      fVar133 = auVar103._24_4_;
      auVar104._4_4_ = fVar195 * fVar195 * fVar195 * auVar83._4_4_ * -0.5;
      auVar104._0_4_ = fVar156 * fVar156 * fVar156 * auVar83._0_4_ * -0.5;
      auVar104._8_4_ = fVar196 * fVar196 * fVar196 * auVar83._8_4_ * -0.5;
      auVar104._12_4_ = fVar70 * fVar70 * fVar70 * auVar83._12_4_ * -0.5;
      auVar104._16_4_ = fVar71 * fVar71 * fVar71 * -0.0;
      auVar104._20_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar104._24_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar104._28_4_ = 0;
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar103);
      auVar94._4_4_ = auVar111._4_4_ * auVar104._4_4_;
      auVar94._0_4_ = auVar111._0_4_ * auVar104._0_4_;
      auVar94._8_4_ = auVar111._8_4_ * auVar104._8_4_;
      auVar94._12_4_ = auVar111._12_4_ * auVar104._12_4_;
      auVar94._16_4_ = auVar111._16_4_ * auVar104._16_4_;
      auVar94._20_4_ = auVar111._20_4_ * auVar104._20_4_;
      auVar94._24_4_ = auVar111._24_4_ * auVar104._24_4_;
      auVar94._28_4_ = auVar103._28_4_;
      auVar103._4_4_ = -auVar110._4_4_ * auVar104._4_4_;
      auVar103._0_4_ = -auVar110._0_4_ * auVar104._0_4_;
      auVar103._8_4_ = -auVar110._8_4_ * auVar104._8_4_;
      auVar103._12_4_ = -auVar110._12_4_ * auVar104._12_4_;
      auVar103._16_4_ = -fVar197 * auVar104._16_4_;
      auVar103._20_4_ = -fVar198 * auVar104._20_4_;
      auVar103._24_4_ = -fVar168 * auVar104._24_4_;
      auVar103._28_4_ = auVar106._28_4_;
      auVar106 = vmulps_avx512vl(auVar104,auVar98);
      auVar83 = vfmadd213ps_fma(auVar107,auVar100,auVar95);
      auVar88 = vfmadd213ps_fma(auVar105,auVar100,auVar96);
      auVar104 = vfmadd213ps_avx512vl(auVar93,auVar100,auVar102);
      auVar92 = vfmadd213ps_avx512vl(auVar94,ZEXT1632(auVar78),ZEXT1632(auVar76));
      auVar91 = vfnmadd213ps_fma(auVar107,auVar100,auVar95);
      auVar95 = ZEXT1632(auVar78);
      auVar85 = vfmadd213ps_fma(auVar103,auVar95,ZEXT1632(auVar77));
      auVar218 = vfnmadd213ps_fma(auVar105,auVar100,auVar96);
      auVar84 = vfmadd213ps_fma(auVar106,auVar95,auVar97);
      auVar107 = vfnmadd231ps_avx512vl(auVar102,auVar100,auVar93);
      auVar76 = vfnmadd213ps_fma(auVar94,auVar95,ZEXT1632(auVar76));
      auVar77 = vfnmadd213ps_fma(auVar103,auVar95,ZEXT1632(auVar77));
      auVar18 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar78),auVar106);
      auVar105 = vsubps_avx512vl(auVar92,ZEXT1632(auVar91));
      auVar106 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar218));
      auVar93 = vsubps_avx512vl(ZEXT1632(auVar84),auVar107);
      auVar94 = vmulps_avx512vl(auVar106,auVar107);
      auVar16 = vfmsub231ps_fma(auVar94,ZEXT1632(auVar218),auVar93);
      auVar97._4_4_ = auVar91._4_4_ * auVar93._4_4_;
      auVar97._0_4_ = auVar91._0_4_ * auVar93._0_4_;
      auVar97._8_4_ = auVar91._8_4_ * auVar93._8_4_;
      auVar97._12_4_ = auVar91._12_4_ * auVar93._12_4_;
      auVar97._16_4_ = auVar93._16_4_ * 0.0;
      auVar97._20_4_ = auVar93._20_4_ * 0.0;
      auVar97._24_4_ = auVar93._24_4_ * 0.0;
      auVar97._28_4_ = auVar93._28_4_;
      auVar93 = vfmsub231ps_avx512vl(auVar97,auVar107,auVar105);
      auVar95._4_4_ = auVar218._4_4_ * auVar105._4_4_;
      auVar95._0_4_ = auVar218._0_4_ * auVar105._0_4_;
      auVar95._8_4_ = auVar218._8_4_ * auVar105._8_4_;
      auVar95._12_4_ = auVar218._12_4_ * auVar105._12_4_;
      auVar95._16_4_ = auVar105._16_4_ * 0.0;
      auVar95._20_4_ = auVar105._20_4_ * 0.0;
      auVar95._24_4_ = auVar105._24_4_ * 0.0;
      auVar95._28_4_ = auVar105._28_4_;
      auVar80 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar91),auVar106);
      auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar98,auVar93);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,ZEXT1632(auVar16));
      auVar102 = ZEXT1632(auVar74);
      uVar65 = vcmpps_avx512vl(auVar106,auVar102,2);
      bVar58 = (byte)uVar65;
      fVar70 = (float)((uint)(bVar58 & 1) * auVar83._0_4_ |
                      (uint)!(bool)(bVar58 & 1) * auVar76._0_4_);
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      fVar132 = (float)((uint)bVar10 * auVar83._4_4_ | (uint)!bVar10 * auVar76._4_4_);
      bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
      fVar134 = (float)((uint)bVar10 * auVar83._8_4_ | (uint)!bVar10 * auVar76._8_4_);
      bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
      fVar137 = (float)((uint)bVar10 * auVar83._12_4_ | (uint)!bVar10 * auVar76._12_4_);
      auVar94 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar134,CONCAT44(fVar132,fVar70))));
      fVar71 = (float)((uint)(bVar58 & 1) * auVar88._0_4_ |
                      (uint)!(bool)(bVar58 & 1) * auVar77._0_4_);
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      fVar133 = (float)((uint)bVar10 * auVar88._4_4_ | (uint)!bVar10 * auVar77._4_4_);
      bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
      fVar135 = (float)((uint)bVar10 * auVar88._8_4_ | (uint)!bVar10 * auVar77._8_4_);
      bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
      fVar138 = (float)((uint)bVar10 * auVar88._12_4_ | (uint)!bVar10 * auVar77._12_4_);
      auVar103 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar133,fVar71))));
      auVar112._0_4_ =
           (float)((uint)(bVar58 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar18._0_4_);
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar10 * auVar104._4_4_ | (uint)!bVar10 * auVar18._4_4_);
      bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar10 * auVar104._8_4_ | (uint)!bVar10 * auVar18._8_4_);
      bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar10 * auVar104._12_4_ | (uint)!bVar10 * auVar18._12_4_);
      fVar156 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar104._16_4_);
      auVar112._16_4_ = fVar156;
      fVar195 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar104._20_4_);
      auVar112._20_4_ = fVar195;
      fVar196 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar104._24_4_);
      auVar112._24_4_ = fVar196;
      iVar1 = (uint)(byte)(uVar65 >> 7) * auVar104._28_4_;
      auVar112._28_4_ = iVar1;
      auVar105 = vblendmps_avx512vl(ZEXT1632(auVar91),auVar92);
      auVar113._0_4_ =
           (uint)(bVar58 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar16._0_4_;
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar16._4_4_;
      bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar16._8_4_;
      bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar16._12_4_;
      auVar113._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * auVar105._16_4_;
      auVar113._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * auVar105._20_4_;
      auVar113._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * auVar105._24_4_;
      auVar113._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar105._28_4_;
      auVar105 = vblendmps_avx512vl(ZEXT1632(auVar218),ZEXT1632(auVar85));
      auVar114._0_4_ =
           (float)((uint)(bVar58 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar88._0_4_);
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar88._4_4_);
      bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar88._8_4_);
      bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar88._12_4_);
      fVar198 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar105._16_4_);
      auVar114._16_4_ = fVar198;
      fVar168 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar105._20_4_);
      auVar114._20_4_ = fVar168;
      fVar197 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar105._24_4_);
      auVar114._24_4_ = fVar197;
      auVar114._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar105._28_4_;
      auVar105 = vblendmps_avx512vl(auVar107,ZEXT1632(auVar84));
      auVar115._0_4_ =
           (float)((uint)(bVar58 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar104._0_4_)
      ;
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar104._4_4_);
      bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar104._8_4_);
      bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar104._12_4_);
      bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar115._16_4_ = (float)((uint)bVar10 * auVar105._16_4_ | (uint)!bVar10 * auVar104._16_4_);
      bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar115._20_4_ = (float)((uint)bVar10 * auVar105._20_4_ | (uint)!bVar10 * auVar104._20_4_);
      bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar115._24_4_ = (float)((uint)bVar10 * auVar105._24_4_ | (uint)!bVar10 * auVar104._24_4_);
      bVar10 = SUB81(uVar65 >> 7,0);
      auVar115._28_4_ = (uint)bVar10 * auVar105._28_4_ | (uint)!bVar10 * auVar104._28_4_;
      auVar116._0_4_ =
           (uint)(bVar58 & 1) * (int)auVar91._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar92._0_4_;
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar10 * (int)auVar91._4_4_ | (uint)!bVar10 * auVar92._4_4_;
      bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar10 * (int)auVar91._8_4_ | (uint)!bVar10 * auVar92._8_4_;
      bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar10 * (int)auVar91._12_4_ | (uint)!bVar10 * auVar92._12_4_;
      auVar116._16_4_ = (uint)!(bool)((byte)(uVar65 >> 4) & 1) * auVar92._16_4_;
      auVar116._20_4_ = (uint)!(bool)((byte)(uVar65 >> 5) & 1) * auVar92._20_4_;
      auVar116._24_4_ = (uint)!(bool)((byte)(uVar65 >> 6) & 1) * auVar92._24_4_;
      auVar116._28_4_ = (uint)!SUB81(uVar65 >> 7,0) * auVar92._28_4_;
      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
      bVar13 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar117._0_4_ =
           (uint)(bVar58 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar84._0_4_;
      bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar11 * auVar107._4_4_ | (uint)!bVar11 * auVar84._4_4_;
      bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar11 * auVar107._8_4_ | (uint)!bVar11 * auVar84._8_4_;
      bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar11 * auVar107._12_4_ | (uint)!bVar11 * auVar84._12_4_;
      auVar117._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * auVar107._16_4_;
      auVar117._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * auVar107._20_4_;
      auVar117._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * auVar107._24_4_;
      iVar2 = (uint)(byte)(uVar65 >> 7) * auVar107._28_4_;
      auVar117._28_4_ = iVar2;
      auVar97 = vsubps_avx512vl(auVar116,auVar94);
      auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar13 * (int)auVar218._12_4_ |
                                               (uint)!bVar13 * auVar85._12_4_,
                                               CONCAT48((uint)bVar12 * (int)auVar218._8_4_ |
                                                        (uint)!bVar12 * auVar85._8_4_,
                                                        CONCAT44((uint)bVar10 * (int)auVar218._4_4_
                                                                 | (uint)!bVar10 * auVar85._4_4_,
                                                                 (uint)(bVar58 & 1) *
                                                                 (int)auVar218._0_4_ |
                                                                 (uint)!(bool)(bVar58 & 1) *
                                                                 auVar85._0_4_)))),auVar103);
      auVar189 = ZEXT3264(auVar107);
      auVar105 = vsubps_avx(auVar117,auVar112);
      auVar104 = vsubps_avx(auVar94,auVar113);
      auVar192 = ZEXT3264(auVar104);
      auVar92 = vsubps_avx(auVar103,auVar114);
      auVar93 = vsubps_avx(auVar112,auVar115);
      auVar96._4_4_ = auVar105._4_4_ * fVar132;
      auVar96._0_4_ = auVar105._0_4_ * fVar70;
      auVar96._8_4_ = auVar105._8_4_ * fVar134;
      auVar96._12_4_ = auVar105._12_4_ * fVar137;
      auVar96._16_4_ = auVar105._16_4_ * 0.0;
      auVar96._20_4_ = auVar105._20_4_ * 0.0;
      auVar96._24_4_ = auVar105._24_4_ * 0.0;
      auVar96._28_4_ = iVar2;
      auVar83 = vfmsub231ps_fma(auVar96,auVar112,auVar97);
      auVar98._4_4_ = fVar133 * auVar97._4_4_;
      auVar98._0_4_ = fVar71 * auVar97._0_4_;
      auVar98._8_4_ = fVar135 * auVar97._8_4_;
      auVar98._12_4_ = fVar138 * auVar97._12_4_;
      auVar98._16_4_ = auVar97._16_4_ * 0.0;
      auVar98._20_4_ = auVar97._20_4_ * 0.0;
      auVar98._24_4_ = auVar97._24_4_ * 0.0;
      auVar98._28_4_ = auVar106._28_4_;
      auVar88 = vfmsub231ps_fma(auVar98,auVar94,auVar107);
      auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar102,ZEXT1632(auVar83));
      auVar182._0_4_ = auVar107._0_4_ * auVar112._0_4_;
      auVar182._4_4_ = auVar107._4_4_ * auVar112._4_4_;
      auVar182._8_4_ = auVar107._8_4_ * auVar112._8_4_;
      auVar182._12_4_ = auVar107._12_4_ * auVar112._12_4_;
      auVar182._16_4_ = auVar107._16_4_ * fVar156;
      auVar182._20_4_ = auVar107._20_4_ * fVar195;
      auVar182._24_4_ = auVar107._24_4_ * fVar196;
      auVar182._28_4_ = 0;
      auVar83 = vfmsub231ps_fma(auVar182,auVar103,auVar105);
      auVar95 = vfmadd231ps_avx512vl(auVar106,auVar102,ZEXT1632(auVar83));
      auVar106 = vmulps_avx512vl(auVar93,auVar113);
      auVar106 = vfmsub231ps_avx512vl(auVar106,auVar104,auVar115);
      auVar99._4_4_ = auVar92._4_4_ * auVar115._4_4_;
      auVar99._0_4_ = auVar92._0_4_ * auVar115._0_4_;
      auVar99._8_4_ = auVar92._8_4_ * auVar115._8_4_;
      auVar99._12_4_ = auVar92._12_4_ * auVar115._12_4_;
      auVar99._16_4_ = auVar92._16_4_ * auVar115._16_4_;
      auVar99._20_4_ = auVar92._20_4_ * auVar115._20_4_;
      auVar99._24_4_ = auVar92._24_4_ * auVar115._24_4_;
      auVar99._28_4_ = auVar115._28_4_;
      auVar83 = vfmsub231ps_fma(auVar99,auVar114,auVar93);
      auVar183._0_4_ = auVar114._0_4_ * auVar104._0_4_;
      auVar183._4_4_ = auVar114._4_4_ * auVar104._4_4_;
      auVar183._8_4_ = auVar114._8_4_ * auVar104._8_4_;
      auVar183._12_4_ = auVar114._12_4_ * auVar104._12_4_;
      auVar183._16_4_ = fVar198 * auVar104._16_4_;
      auVar183._20_4_ = fVar168 * auVar104._20_4_;
      auVar183._24_4_ = fVar197 * auVar104._24_4_;
      auVar183._28_4_ = 0;
      auVar88 = vfmsub231ps_fma(auVar183,auVar92,auVar113);
      auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar102,auVar106);
      auVar96 = vfmadd231ps_avx512vl(auVar106,auVar102,ZEXT1632(auVar83));
      auVar186 = ZEXT3264(auVar96);
      auVar106 = vmaxps_avx(auVar95,auVar96);
      uVar149 = vcmpps_avx512vl(auVar106,auVar102,2);
      bVar67 = bVar67 & (byte)uVar149;
      if (bVar67 != 0) {
        auVar36._4_4_ = auVar93._4_4_ * auVar107._4_4_;
        auVar36._0_4_ = auVar93._0_4_ * auVar107._0_4_;
        auVar36._8_4_ = auVar93._8_4_ * auVar107._8_4_;
        auVar36._12_4_ = auVar93._12_4_ * auVar107._12_4_;
        auVar36._16_4_ = auVar93._16_4_ * auVar107._16_4_;
        auVar36._20_4_ = auVar93._20_4_ * auVar107._20_4_;
        auVar36._24_4_ = auVar93._24_4_ * auVar107._24_4_;
        auVar36._28_4_ = auVar106._28_4_;
        auVar84 = vfmsub231ps_fma(auVar36,auVar92,auVar105);
        auVar37._4_4_ = auVar105._4_4_ * auVar104._4_4_;
        auVar37._0_4_ = auVar105._0_4_ * auVar104._0_4_;
        auVar37._8_4_ = auVar105._8_4_ * auVar104._8_4_;
        auVar37._12_4_ = auVar105._12_4_ * auVar104._12_4_;
        auVar37._16_4_ = auVar105._16_4_ * auVar104._16_4_;
        auVar37._20_4_ = auVar105._20_4_ * auVar104._20_4_;
        auVar37._24_4_ = auVar105._24_4_ * auVar104._24_4_;
        auVar37._28_4_ = auVar105._28_4_;
        auVar85 = vfmsub231ps_fma(auVar37,auVar97,auVar93);
        auVar38._4_4_ = auVar92._4_4_ * auVar97._4_4_;
        auVar38._0_4_ = auVar92._0_4_ * auVar97._0_4_;
        auVar38._8_4_ = auVar92._8_4_ * auVar97._8_4_;
        auVar38._12_4_ = auVar92._12_4_ * auVar97._12_4_;
        auVar38._16_4_ = auVar92._16_4_ * auVar97._16_4_;
        auVar38._20_4_ = auVar92._20_4_ * auVar97._20_4_;
        auVar38._24_4_ = auVar92._24_4_ * auVar97._24_4_;
        auVar38._28_4_ = auVar92._28_4_;
        auVar16 = vfmsub231ps_fma(auVar38,auVar104,auVar107);
        auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar16));
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar106 = vrcp14ps_avx512vl(ZEXT1632(auVar88));
        auVar27._8_4_ = 0x3f800000;
        auVar27._0_8_ = 0x3f8000003f800000;
        auVar27._12_4_ = 0x3f800000;
        auVar27._16_4_ = 0x3f800000;
        auVar27._20_4_ = 0x3f800000;
        auVar27._24_4_ = 0x3f800000;
        auVar27._28_4_ = 0x3f800000;
        auVar107 = vfnmadd213ps_avx512vl(auVar106,ZEXT1632(auVar88),auVar27);
        auVar83 = vfmadd132ps_fma(auVar107,auVar106,auVar106);
        auVar189 = ZEXT1664(auVar83);
        auVar39._4_4_ = auVar16._4_4_ * auVar112._4_4_;
        auVar39._0_4_ = auVar16._0_4_ * auVar112._0_4_;
        auVar39._8_4_ = auVar16._8_4_ * auVar112._8_4_;
        auVar39._12_4_ = auVar16._12_4_ * auVar112._12_4_;
        auVar39._16_4_ = fVar156 * 0.0;
        auVar39._20_4_ = fVar195 * 0.0;
        auVar39._24_4_ = fVar196 * 0.0;
        auVar39._28_4_ = iVar1;
        auVar85 = vfmadd231ps_fma(auVar39,auVar103,ZEXT1632(auVar85));
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar94,ZEXT1632(auVar84));
        fVar195 = auVar83._0_4_;
        fVar196 = auVar83._4_4_;
        fVar197 = auVar83._8_4_;
        fVar198 = auVar83._12_4_;
        local_240._28_4_ = auVar106._28_4_;
        local_240._0_28_ =
             ZEXT1628(CONCAT412(auVar85._12_4_ * fVar198,
                                CONCAT48(auVar85._8_4_ * fVar197,
                                         CONCAT44(auVar85._4_4_ * fVar196,auVar85._0_4_ * fVar195)))
                     );
        auVar192 = ZEXT3264(local_240);
        auVar142._8_4_ = 3;
        auVar142._0_8_ = 0x300000003;
        auVar142._12_4_ = 3;
        auVar142._16_4_ = 3;
        auVar142._20_4_ = 3;
        auVar142._24_4_ = 3;
        auVar142._28_4_ = 3;
        auVar106 = vpermps_avx2(auVar142,ZEXT1632((undefined1  [16])aVar4));
        uVar149 = vcmpps_avx512vl(auVar106,local_240,2);
        fVar156 = (local_530->super_RayK<1>).tfar;
        auVar28._4_4_ = fVar156;
        auVar28._0_4_ = fVar156;
        auVar28._8_4_ = fVar156;
        auVar28._12_4_ = fVar156;
        auVar28._16_4_ = fVar156;
        auVar28._20_4_ = fVar156;
        auVar28._24_4_ = fVar156;
        auVar28._28_4_ = fVar156;
        uVar20 = vcmpps_avx512vl(local_240,auVar28,2);
        bVar67 = (byte)uVar149 & (byte)uVar20 & bVar67;
        if (bVar67 != 0) {
          uVar69 = vcmpps_avx512vl(ZEXT1632(auVar88),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar69 = bVar67 & uVar69;
          if ((char)uVar69 != '\0') {
            fVar156 = auVar95._0_4_ * fVar195;
            fVar168 = auVar95._4_4_ * fVar196;
            auVar40._4_4_ = fVar168;
            auVar40._0_4_ = fVar156;
            fVar70 = auVar95._8_4_ * fVar197;
            auVar40._8_4_ = fVar70;
            fVar71 = auVar95._12_4_ * fVar198;
            auVar40._12_4_ = fVar71;
            fVar132 = auVar95._16_4_ * 0.0;
            auVar40._16_4_ = fVar132;
            fVar133 = auVar95._20_4_ * 0.0;
            auVar40._20_4_ = fVar133;
            fVar134 = auVar95._24_4_ * 0.0;
            auVar40._24_4_ = fVar134;
            auVar40._28_4_ = auVar95._28_4_;
            auVar143._8_4_ = 0x3f800000;
            auVar143._0_8_ = 0x3f8000003f800000;
            auVar143._12_4_ = 0x3f800000;
            auVar143._16_4_ = 0x3f800000;
            auVar143._20_4_ = 0x3f800000;
            auVar143._24_4_ = 0x3f800000;
            auVar143._28_4_ = 0x3f800000;
            auVar106 = vsubps_avx(auVar143,auVar40);
            local_280._0_4_ =
                 (float)((uint)(bVar58 & 1) * (int)fVar156 |
                        (uint)!(bool)(bVar58 & 1) * auVar106._0_4_);
            bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar10 * (int)fVar168 | (uint)!bVar10 * auVar106._4_4_);
            bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar10 * (int)fVar70 | (uint)!bVar10 * auVar106._8_4_);
            bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar10 * (int)fVar71 | (uint)!bVar10 * auVar106._12_4_)
            ;
            bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
            local_280._16_4_ =
                 (float)((uint)bVar10 * (int)fVar132 | (uint)!bVar10 * auVar106._16_4_);
            bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
            local_280._20_4_ =
                 (float)((uint)bVar10 * (int)fVar133 | (uint)!bVar10 * auVar106._20_4_);
            bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
            local_280._24_4_ =
                 (float)((uint)bVar10 * (int)fVar134 | (uint)!bVar10 * auVar106._24_4_);
            bVar10 = SUB81(uVar65 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar10 * auVar95._28_4_ | (uint)!bVar10 * auVar106._28_4_);
            auVar106 = vsubps_avx(ZEXT1632(auVar78),auVar100);
            auVar83 = vfmadd213ps_fma(auVar106,local_280,auVar100);
            fVar156 = local_508->depth_scale;
            auVar100._4_4_ = fVar156;
            auVar100._0_4_ = fVar156;
            auVar100._8_4_ = fVar156;
            auVar100._12_4_ = fVar156;
            auVar100._16_4_ = fVar156;
            auVar100._20_4_ = fVar156;
            auVar100._24_4_ = fVar156;
            auVar100._28_4_ = fVar156;
            auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                          CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                   CONCAT44(auVar83._4_4_ +
                                                                            auVar83._4_4_,
                                                                            auVar83._0_4_ +
                                                                            auVar83._0_4_)))),
                                       auVar100);
            uVar19 = vcmpps_avx512vl(local_240,auVar106,6);
            uVar69 = uVar69 & uVar19;
            bVar67 = (byte)uVar69;
            if (bVar67 != 0) {
              auVar166._0_4_ = auVar96._0_4_ * fVar195;
              auVar166._4_4_ = auVar96._4_4_ * fVar196;
              auVar166._8_4_ = auVar96._8_4_ * fVar197;
              auVar166._12_4_ = auVar96._12_4_ * fVar198;
              auVar166._16_4_ = auVar96._16_4_ * 0.0;
              auVar166._20_4_ = auVar96._20_4_ * 0.0;
              auVar166._24_4_ = auVar96._24_4_ * 0.0;
              auVar166._28_4_ = 0;
              auVar171._8_4_ = 0x3f800000;
              auVar171._0_8_ = 0x3f8000003f800000;
              auVar171._12_4_ = 0x3f800000;
              auVar171._16_4_ = 0x3f800000;
              auVar171._20_4_ = 0x3f800000;
              auVar171._24_4_ = 0x3f800000;
              auVar171._28_4_ = 0x3f800000;
              auVar106 = vsubps_avx(auVar171,auVar166);
              auVar118._0_4_ =
                   (uint)(bVar58 & 1) * (int)auVar166._0_4_ |
                   (uint)!(bool)(bVar58 & 1) * auVar106._0_4_;
              bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
              auVar118._4_4_ = (uint)bVar10 * (int)auVar166._4_4_ | (uint)!bVar10 * auVar106._4_4_;
              bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
              auVar118._8_4_ = (uint)bVar10 * (int)auVar166._8_4_ | (uint)!bVar10 * auVar106._8_4_;
              bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
              auVar118._12_4_ =
                   (uint)bVar10 * (int)auVar166._12_4_ | (uint)!bVar10 * auVar106._12_4_;
              bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
              auVar118._16_4_ =
                   (uint)bVar10 * (int)auVar166._16_4_ | (uint)!bVar10 * auVar106._16_4_;
              bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
              auVar118._20_4_ =
                   (uint)bVar10 * (int)auVar166._20_4_ | (uint)!bVar10 * auVar106._20_4_;
              bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
              auVar118._24_4_ =
                   (uint)bVar10 * (int)auVar166._24_4_ | (uint)!bVar10 * auVar106._24_4_;
              auVar118._28_4_ = (uint)!SUB81(uVar65 >> 7,0) * auVar106._28_4_;
              auVar29._8_4_ = 0x40000000;
              auVar29._0_8_ = 0x4000000040000000;
              auVar29._12_4_ = 0x40000000;
              auVar29._16_4_ = 0x40000000;
              auVar29._20_4_ = 0x40000000;
              auVar29._24_4_ = 0x40000000;
              auVar29._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar118,auVar171,auVar29);
              local_220 = 0;
              local_21c = iVar7;
              local_210 = local_4a0._0_8_;
              uStack_208 = local_4a0._8_8_;
              local_200 = local_4b0._0_8_;
              uStack_1f8 = local_4b0._8_8_;
              local_1f0 = local_4c0._0_8_;
              uStack_1e8 = local_4c0._8_8_;
              local_1e0 = local_4d0;
              uStack_1d8 = uStack_4c8;
              if ((pGVar64->mask & (local_530->super_RayK<1>).mask) != 0) {
                fVar156 = 1.0 / auVar210._0_4_;
                local_1c0[0] = fVar156 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar156 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar156 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar156 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar156 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar156 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar156 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                auVar144._8_4_ = 0x7f800000;
                auVar144._0_8_ = 0x7f8000007f800000;
                auVar144._12_4_ = 0x7f800000;
                auVar144._16_4_ = 0x7f800000;
                auVar144._20_4_ = 0x7f800000;
                auVar144._24_4_ = 0x7f800000;
                auVar144._28_4_ = 0x7f800000;
                auVar106 = vblendmps_avx512vl(auVar144,local_240);
                auVar119._0_4_ =
                     (uint)(bVar67 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
                bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
                auVar119._4_4_ = (uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
                auVar119._8_4_ = (uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
                auVar119._12_4_ = (uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
                auVar119._16_4_ = (uint)bVar10 * auVar106._16_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
                auVar119._20_4_ = (uint)bVar10 * auVar106._20_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
                auVar119._24_4_ = (uint)bVar10 * auVar106._24_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = SUB81(uVar69 >> 7,0);
                auVar119._28_4_ = (uint)bVar10 * auVar106._28_4_ | (uint)!bVar10 * 0x7f800000;
                auVar106 = vshufps_avx(auVar119,auVar119,0xb1);
                auVar106 = vminps_avx(auVar119,auVar106);
                auVar107 = vshufpd_avx(auVar106,auVar106,5);
                auVar106 = vminps_avx(auVar106,auVar107);
                auVar107 = vpermpd_avx2(auVar106,0x4e);
                auVar106 = vminps_avx(auVar106,auVar107);
                uVar149 = vcmpps_avx512vl(auVar119,auVar106,0);
                uVar59 = (uint)uVar69;
                if ((bVar67 & (byte)uVar149) != 0) {
                  uVar59 = (uint)(bVar67 & (byte)uVar149);
                }
                uVar21 = 0;
                for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
                  uVar21 = uVar21 + 1;
                }
                uVar65 = (ulong)uVar21;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar64->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_3c0 = ZEXT432((uint)(local_530->super_RayK<1>).tfar);
                  local_3e0 = local_240;
                  local_440 = auVar101;
                  do {
                    local_484 = local_1c0[uVar65];
                    local_480 = *(undefined4 *)(local_1a0 + uVar65 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar65 * 4);
                    local_500.context = context->user;
                    fVar156 = 1.0 - local_484;
                    auVar26._8_4_ = 0x80000000;
                    auVar26._0_8_ = 0x8000000080000000;
                    auVar26._12_4_ = 0x80000000;
                    auVar85 = vxorps_avx512vl(ZEXT416((uint)fVar156),auVar26);
                    auVar83 = ZEXT416((uint)(local_484 * fVar156 * 4.0));
                    auVar88 = vfnmsub213ss_fma(ZEXT416((uint)local_484),ZEXT416((uint)local_484),
                                               auVar83);
                    auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),auVar83)
                    ;
                    fVar156 = fVar156 * auVar85._0_4_ * 0.5;
                    fVar195 = auVar88._0_4_ * 0.5;
                    auVar189 = ZEXT464((uint)fVar195);
                    fVar196 = auVar83._0_4_ * 0.5;
                    fVar197 = local_484 * local_484 * 0.5;
                    auVar180._0_4_ = fVar197 * (float)local_4d0._0_4_;
                    auVar180._4_4_ = fVar197 * (float)local_4d0._4_4_;
                    auVar180._8_4_ = fVar197 * (float)uStack_4c8;
                    auVar180._12_4_ = fVar197 * uStack_4c8._4_4_;
                    auVar164._4_4_ = fVar196;
                    auVar164._0_4_ = fVar196;
                    auVar164._8_4_ = fVar196;
                    auVar164._12_4_ = fVar196;
                    auVar83 = vfmadd132ps_fma(auVar164,auVar180,local_4c0);
                    auVar181._4_4_ = fVar195;
                    auVar181._0_4_ = fVar195;
                    auVar181._8_4_ = fVar195;
                    auVar181._12_4_ = fVar195;
                    auVar83 = vfmadd132ps_fma(auVar181,auVar83,local_4b0);
                    auVar186 = ZEXT1664(auVar83);
                    auVar165._4_4_ = fVar156;
                    auVar165._0_4_ = fVar156;
                    auVar165._8_4_ = fVar156;
                    auVar165._12_4_ = fVar156;
                    auVar88 = vfmadd132ps_fma(auVar165,auVar83,local_4a0);
                    local_490 = vmovlps_avx(auVar88);
                    local_488 = vextractps_avx(auVar88,2);
                    local_47c = (int)local_518;
                    local_478 = (int)local_528;
                    local_474 = (local_500.context)->instID[0];
                    local_470 = (local_500.context)->instPrimID[0];
                    local_53c = -1;
                    local_500.valid = &local_53c;
                    local_500.geometryUserPtr = pGVar64->userPtr;
                    local_500.ray = (RTCRayN *)ray;
                    local_500.hit = (RTCHitN *)&local_490;
                    local_500.N = 1;
                    if (pGVar64->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018e25b0:
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar64->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar186 = ZEXT1664(auVar186._0_16_);
                        auVar189 = ZEXT1664(auVar189._0_16_);
                        (*p_Var9)(&local_500);
                        auVar192 = ZEXT3264(local_3e0);
                        auVar217 = ZEXT3264(local_440);
                        auVar220 = ZEXT1664(local_450);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar219 = ZEXT1664(auVar83);
                        ray = local_530;
                        if (*local_500.valid == 0) goto LAB_018e2663;
                      }
                      (((Vec3f *)((long)local_500.ray + 0x30))->field_0).components[0] =
                           *(float *)local_500.hit;
                      (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_500.hit + 4);
                      (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_500.hit + 8);
                      *(float *)((long)local_500.ray + 0x3c) = *(float *)(local_500.hit + 0xc);
                      *(float *)((long)local_500.ray + 0x40) = *(float *)(local_500.hit + 0x10);
                      *(float *)((long)local_500.ray + 0x44) = *(float *)(local_500.hit + 0x14);
                      *(float *)((long)local_500.ray + 0x48) = *(float *)(local_500.hit + 0x18);
                      *(float *)((long)local_500.ray + 0x4c) = *(float *)(local_500.hit + 0x1c);
                      *(float *)((long)local_500.ray + 0x50) = *(float *)(local_500.hit + 0x20);
                    }
                    else {
                      auVar186 = ZEXT1664(auVar83);
                      auVar189 = ZEXT464((uint)fVar195);
                      (*pGVar64->intersectionFilterN)(&local_500);
                      auVar192 = ZEXT3264(local_3e0);
                      auVar217 = ZEXT3264(local_440);
                      auVar220 = ZEXT1664(local_450);
                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar219 = ZEXT1664(auVar83);
                      ray = local_530;
                      if (*local_500.valid != 0) goto LAB_018e25b0;
LAB_018e2663:
                      (local_530->super_RayK<1>).tfar = (float)local_3c0._0_4_;
                      ray = local_530;
                    }
                    auVar101 = auVar217._0_32_;
                    bVar67 = ~(byte)(1 << ((uint)uVar65 & 0x1f)) & (byte)uVar69;
                    fVar156 = (ray->super_RayK<1>).tfar;
                    auVar35._4_4_ = fVar156;
                    auVar35._0_4_ = fVar156;
                    auVar35._8_4_ = fVar156;
                    auVar35._12_4_ = fVar156;
                    auVar35._16_4_ = fVar156;
                    auVar35._20_4_ = fVar156;
                    auVar35._24_4_ = fVar156;
                    auVar35._28_4_ = fVar156;
                    uVar149 = vcmpps_avx512vl(auVar192._0_32_,auVar35,2);
                    prim = local_510;
                    if ((bVar67 & (byte)uVar149) == 0) goto LAB_018e17ba;
                    local_3c0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    bVar67 = bVar67 & (byte)uVar149;
                    uVar69 = (ulong)bVar67;
                    auVar148._8_4_ = 0x7f800000;
                    auVar148._0_8_ = 0x7f8000007f800000;
                    auVar148._12_4_ = 0x7f800000;
                    auVar148._16_4_ = 0x7f800000;
                    auVar148._20_4_ = 0x7f800000;
                    auVar148._24_4_ = 0x7f800000;
                    auVar148._28_4_ = 0x7f800000;
                    auVar106 = vblendmps_avx512vl(auVar148,auVar192._0_32_);
                    auVar101._0_4_ =
                         (uint)(bVar67 & 1) * auVar106._0_4_ |
                         (uint)!(bool)(bVar67 & 1) * 0x7f800000;
                    bVar10 = (bool)(bVar67 >> 1 & 1);
                    auVar101._4_4_ = (uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar67 >> 2 & 1);
                    auVar101._8_4_ = (uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar67 >> 3 & 1);
                    auVar101._12_4_ = (uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar67 >> 4 & 1);
                    auVar101._16_4_ = (uint)bVar10 * auVar106._16_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar67 >> 5 & 1);
                    auVar101._20_4_ = (uint)bVar10 * auVar106._20_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar67 >> 6 & 1);
                    auVar101._24_4_ = (uint)bVar10 * auVar106._24_4_ | (uint)!bVar10 * 0x7f800000;
                    auVar101._28_4_ =
                         (uint)(bVar67 >> 7) * auVar106._28_4_ |
                         (uint)!(bool)(bVar67 >> 7) * 0x7f800000;
                    auVar106 = vshufps_avx(auVar101,auVar101,0xb1);
                    auVar106 = vminps_avx(auVar101,auVar106);
                    auVar107 = vshufpd_avx(auVar106,auVar106,5);
                    auVar106 = vminps_avx(auVar106,auVar107);
                    auVar107 = vpermpd_avx2(auVar106,0x4e);
                    auVar106 = vminps_avx(auVar106,auVar107);
                    uVar149 = vcmpps_avx512vl(auVar101,auVar106,0);
                    bVar58 = (byte)uVar149 & bVar67;
                    if (bVar58 != 0) {
                      bVar67 = bVar58;
                    }
                    uVar68 = 0;
                    for (uVar60 = (uint)bVar67; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x80000000
                        ) {
                      uVar68 = uVar68 + 1;
                    }
                    uVar65 = (ulong)uVar68;
                  } while( true );
                }
                fVar156 = local_1c0[uVar65];
                fVar195 = *(float *)(local_1a0 + uVar65 * 4);
                fVar196 = 1.0 - fVar156;
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar85 = vxorps_avx512vl(ZEXT416((uint)fVar196),auVar22);
                auVar83 = ZEXT416((uint)(fVar156 * fVar196 * 4.0));
                auVar88 = vfnmsub213ss_fma(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),auVar83);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),auVar83);
                fVar196 = fVar196 * auVar85._0_4_ * 0.5;
                fVar197 = auVar88._0_4_ * 0.5;
                auVar189 = ZEXT464((uint)fVar197);
                fVar198 = auVar83._0_4_ * 0.5;
                fVar168 = fVar156 * fVar156 * 0.5;
                auVar174._0_4_ = fVar168 * (float)local_4d0._0_4_;
                auVar174._4_4_ = fVar168 * (float)local_4d0._4_4_;
                auVar174._8_4_ = fVar168 * (float)uStack_4c8;
                auVar174._12_4_ = fVar168 * uStack_4c8._4_4_;
                auVar158._4_4_ = fVar198;
                auVar158._0_4_ = fVar198;
                auVar158._8_4_ = fVar198;
                auVar158._12_4_ = fVar198;
                auVar83 = vfmadd132ps_fma(auVar158,auVar174,local_4c0);
                auVar175._4_4_ = fVar197;
                auVar175._0_4_ = fVar197;
                auVar175._8_4_ = fVar197;
                auVar175._12_4_ = fVar197;
                auVar83 = vfmadd132ps_fma(auVar175,auVar83,local_4b0);
                auVar186 = ZEXT1664(auVar83);
                auVar159._4_4_ = fVar196;
                auVar159._0_4_ = fVar196;
                auVar159._8_4_ = fVar196;
                auVar159._12_4_ = fVar196;
                (local_530->super_RayK<1>).tfar = *(float *)(local_180 + uVar65 * 4);
                auVar83 = vfmadd132ps_fma(auVar159,auVar83,local_4a0);
                uVar149 = vmovlps_avx(auVar83);
                *(undefined8 *)&(local_530->Ng).field_0 = uVar149;
                fVar196 = (float)vextractps_avx(auVar83,2);
                (local_530->Ng).field_0.field_0.z = fVar196;
                local_530->u = fVar156;
                local_530->v = fVar195;
                local_530->primID = uVar60;
                local_530->geomID = uVar68;
                local_530->instID[0] = context->user->instID[0];
                local_530->instPrimID[0] = context->user->instPrimID[0];
                prim = local_510;
              }
            }
          }
        }
      }
    }
LAB_018e17ba:
    if (8 < iVar7) {
      local_3c0 = vpbroadcastd_avx512vl();
      local_3e0._4_4_ = local_400._0_4_;
      local_3e0._0_4_ = local_400._0_4_;
      local_3e0._8_4_ = local_400._0_4_;
      local_3e0._12_4_ = local_400._0_4_;
      local_3e0._16_4_ = local_400._0_4_;
      local_3e0._20_4_ = local_400._0_4_;
      local_3e0._24_4_ = local_400._0_4_;
      local_3e0._28_4_ = local_400._0_4_;
      auVar145._8_4_ = 3;
      auVar145._0_8_ = 0x300000003;
      auVar145._12_4_ = 3;
      auVar145._16_4_ = 3;
      auVar145._20_4_ = 3;
      auVar145._24_4_ = 3;
      auVar145._28_4_ = 3;
      local_3a0 = vpermps_avx2(auVar145,local_3a0);
      local_100 = 1.0 / (float)local_420._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar61 = 8;
      local_440 = auVar101;
      lVar63 = local_538;
LAB_018e184a:
      if (lVar61 < lVar63) {
        auVar106 = vpbroadcastd_avx512vl();
        auVar106 = vpor_avx2(auVar106,_DAT_01fb4ba0);
        uVar20 = vpcmpd_avx512vl(auVar106,local_3c0,1);
        auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar61 * 4 + lVar66);
        auVar107 = *(undefined1 (*) [32])(lVar66 + 0x21fffac + lVar61 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar66 + 0x2200430 + lVar61 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar66 + 0x22008b4 + lVar61 * 4);
        auVar217._0_4_ = auVar104._0_4_ * (float)local_360._0_4_;
        auVar217._4_4_ = auVar104._4_4_ * (float)local_360._4_4_;
        auVar217._8_4_ = auVar104._8_4_ * fStack_358;
        auVar217._12_4_ = auVar104._12_4_ * fStack_354;
        auVar217._16_4_ = auVar104._16_4_ * fStack_350;
        auVar217._20_4_ = auVar104._20_4_ * fStack_34c;
        auVar217._28_36_ = auVar189._28_36_;
        auVar217._24_4_ = auVar104._24_4_ * fStack_348;
        auVar189._0_4_ = auVar104._0_4_ * (float)local_380._0_4_;
        auVar189._4_4_ = auVar104._4_4_ * (float)local_380._4_4_;
        auVar189._8_4_ = auVar104._8_4_ * fStack_378;
        auVar189._12_4_ = auVar104._12_4_ * fStack_374;
        auVar189._16_4_ = auVar104._16_4_ * fStack_370;
        auVar189._20_4_ = auVar104._20_4_ * fStack_36c;
        auVar189._28_36_ = auVar186._28_36_;
        auVar189._24_4_ = auVar104._24_4_ * fStack_368;
        auVar92 = vmulps_avx512vl(local_e0,auVar104);
        auVar93 = vfmadd231ps_avx512vl(auVar217._0_32_,auVar105,local_320);
        auVar94 = vfmadd231ps_avx512vl(auVar189._0_32_,auVar105,local_340);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_c0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,local_2e0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,local_300);
        auVar103 = vfmadd231ps_avx512vl(auVar92,auVar107,local_a0);
        auVar83 = vfmadd231ps_fma(auVar93,auVar106,local_2a0);
        auVar189 = ZEXT1664(auVar83);
        auVar88 = vfmadd231ps_fma(auVar94,auVar106,local_2c0);
        auVar186 = ZEXT1664(auVar88);
        auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar61 * 4 + lVar66);
        auVar93 = *(undefined1 (*) [32])(lVar66 + 0x22023cc + lVar61 * 4);
        auVar96 = vfmadd231ps_avx512vl(auVar103,auVar106,local_80);
        auVar94 = *(undefined1 (*) [32])(lVar66 + 0x2202850 + lVar61 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar66 + 0x2202cd4 + lVar61 * 4);
        auVar193._0_4_ = auVar103._0_4_ * (float)local_360._0_4_;
        auVar193._4_4_ = auVar103._4_4_ * (float)local_360._4_4_;
        auVar193._8_4_ = auVar103._8_4_ * fStack_358;
        auVar193._12_4_ = auVar103._12_4_ * fStack_354;
        auVar193._16_4_ = auVar103._16_4_ * fStack_350;
        auVar193._20_4_ = auVar103._20_4_ * fStack_34c;
        auVar193._28_36_ = auVar192._28_36_;
        auVar193._24_4_ = auVar103._24_4_ * fStack_348;
        auVar41._4_4_ = auVar103._4_4_ * (float)local_380._4_4_;
        auVar41._0_4_ = auVar103._0_4_ * (float)local_380._0_4_;
        auVar41._8_4_ = auVar103._8_4_ * fStack_378;
        auVar41._12_4_ = auVar103._12_4_ * fStack_374;
        auVar41._16_4_ = auVar103._16_4_ * fStack_370;
        auVar41._20_4_ = auVar103._20_4_ * fStack_36c;
        auVar41._24_4_ = auVar103._24_4_ * fStack_368;
        auVar41._28_4_ = uStack_364;
        auVar97 = vmulps_avx512vl(local_e0,auVar103);
        auVar95 = vfmadd231ps_avx512vl(auVar193._0_32_,auVar94,local_320);
        auVar98 = vfmadd231ps_avx512vl(auVar41,auVar94,local_340);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_c0);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_2e0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_300);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_a0);
        auVar85 = vfmadd231ps_fma(auVar95,auVar92,local_2a0);
        auVar192 = ZEXT1664(auVar85);
        auVar84 = vfmadd231ps_fma(auVar98,auVar92,local_2c0);
        auVar98 = vfmadd231ps_avx512vl(auVar97,auVar92,local_80);
        auVar99 = vmaxps_avx512vl(auVar96,auVar98);
        auVar97 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar83));
        auVar95 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar88));
        auVar100 = vmulps_avx512vl(ZEXT1632(auVar88),auVar97);
        auVar101 = vmulps_avx512vl(ZEXT1632(auVar83),auVar95);
        auVar100 = vsubps_avx512vl(auVar100,auVar101);
        auVar101 = vmulps_avx512vl(auVar95,auVar95);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar97);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        auVar99 = vmulps_avx512vl(auVar99,auVar101);
        auVar100 = vmulps_avx512vl(auVar100,auVar100);
        uVar149 = vcmpps_avx512vl(auVar100,auVar99,2);
        bVar67 = (byte)uVar20 & (byte)uVar149;
        if (bVar67 != 0) {
          auVar103 = vmulps_avx512vl(local_160,auVar103);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar103);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_120,auVar94);
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_440,auVar93);
          auVar104 = vmulps_avx512vl(local_160,auVar104);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_140,auVar104);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_120,auVar105);
          auVar93 = vfmadd213ps_avx512vl(auVar106,local_440,auVar107);
          auVar106 = *(undefined1 (*) [32])(lVar66 + 0x2200d38 + lVar61 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar66 + 0x22011bc + lVar61 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar66 + 0x2201640 + lVar61 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar66 + 0x2201ac4 + lVar61 * 4);
          auVar94 = vmulps_avx512vl(_local_360,auVar104);
          auVar103 = vmulps_avx512vl(_local_380,auVar104);
          auVar104 = vmulps_avx512vl(local_160,auVar104);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar105,local_320);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,local_340);
          auVar105 = vfmadd231ps_avx512vl(auVar104,local_140,auVar105);
          auVar104 = vfmadd231ps_avx512vl(auVar94,auVar107,local_2e0);
          auVar94 = vfmadd231ps_avx512vl(auVar103,auVar107,local_300);
          auVar107 = vfmadd231ps_avx512vl(auVar105,local_120,auVar107);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar106,local_2a0);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar106,local_2c0);
          auVar16 = vfmadd231ps_fma(auVar107,auVar106,local_440);
          auVar106 = *(undefined1 (*) [32])(lVar66 + 0x2203158 + lVar61 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar66 + 0x2203a60 + lVar61 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar66 + 0x2203ee4 + lVar61 * 4);
          auVar103 = vmulps_avx512vl(_local_360,auVar105);
          auVar99 = vmulps_avx512vl(_local_380,auVar105);
          auVar105 = vmulps_avx512vl(local_160,auVar105);
          auVar219 = ZEXT1664(auVar219._0_16_);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_320);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_340);
          auVar105 = vfmadd231ps_avx512vl(auVar105,local_140,auVar107);
          auVar220 = ZEXT1664(local_450);
          auVar107 = *(undefined1 (*) [32])(lVar66 + 0x22035dc + lVar61 * 4);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_2e0);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_300);
          auVar107 = vfmadd231ps_avx512vl(auVar105,local_120,auVar107);
          auVar105 = vfmadd231ps_avx512vl(auVar103,auVar106,local_2a0);
          auVar103 = vfmadd231ps_avx512vl(auVar99,auVar106,local_2c0);
          auVar107 = vfmadd231ps_avx512vl(auVar107,local_440,auVar106);
          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar104,auVar99);
          vandps_avx512vl(auVar94,auVar99);
          auVar106 = vmaxps_avx(auVar99,auVar99);
          vandps_avx512vl(ZEXT1632(auVar16),auVar99);
          auVar106 = vmaxps_avx(auVar106,auVar99);
          uVar65 = vcmpps_avx512vl(auVar106,local_3e0,1);
          bVar10 = (bool)((byte)uVar65 & 1);
          auVar120._0_4_ = (float)((uint)bVar10 * auVar97._0_4_ | (uint)!bVar10 * auVar104._0_4_);
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar10 * auVar97._4_4_ | (uint)!bVar10 * auVar104._4_4_);
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar10 * auVar97._8_4_ | (uint)!bVar10 * auVar104._8_4_);
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar10 * auVar97._12_4_ | (uint)!bVar10 * auVar104._12_4_)
          ;
          bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar10 * auVar97._16_4_ | (uint)!bVar10 * auVar104._16_4_)
          ;
          bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar10 * auVar97._20_4_ | (uint)!bVar10 * auVar104._20_4_)
          ;
          bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar10 * auVar97._24_4_ | (uint)!bVar10 * auVar104._24_4_)
          ;
          bVar10 = SUB81(uVar65 >> 7,0);
          auVar120._28_4_ = (uint)bVar10 * auVar97._28_4_ | (uint)!bVar10 * auVar104._28_4_;
          bVar10 = (bool)((byte)uVar65 & 1);
          auVar121._0_4_ = (float)((uint)bVar10 * auVar95._0_4_ | (uint)!bVar10 * auVar94._0_4_);
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar10 * auVar95._4_4_ | (uint)!bVar10 * auVar94._4_4_);
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar10 * auVar95._8_4_ | (uint)!bVar10 * auVar94._8_4_);
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar10 * auVar95._12_4_ | (uint)!bVar10 * auVar94._12_4_);
          bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar10 * auVar95._16_4_ | (uint)!bVar10 * auVar94._16_4_);
          bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar10 * auVar95._20_4_ | (uint)!bVar10 * auVar94._20_4_);
          bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar10 * auVar95._24_4_ | (uint)!bVar10 * auVar94._24_4_);
          bVar10 = SUB81(uVar65 >> 7,0);
          auVar121._28_4_ = (uint)bVar10 * auVar95._28_4_ | (uint)!bVar10 * auVar94._28_4_;
          vandps_avx512vl(auVar105,auVar99);
          vandps_avx512vl(auVar103,auVar99);
          auVar106 = vmaxps_avx(auVar121,auVar121);
          vandps_avx512vl(auVar107,auVar99);
          auVar106 = vmaxps_avx(auVar106,auVar121);
          uVar65 = vcmpps_avx512vl(auVar106,local_3e0,1);
          bVar10 = (bool)((byte)uVar65 & 1);
          auVar122._0_4_ = (uint)bVar10 * auVar97._0_4_ | (uint)!bVar10 * auVar105._0_4_;
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar10 * auVar97._4_4_ | (uint)!bVar10 * auVar105._4_4_;
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar10 * auVar97._8_4_ | (uint)!bVar10 * auVar105._8_4_;
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar10 * auVar97._12_4_ | (uint)!bVar10 * auVar105._12_4_;
          bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar122._16_4_ = (uint)bVar10 * auVar97._16_4_ | (uint)!bVar10 * auVar105._16_4_;
          bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar122._20_4_ = (uint)bVar10 * auVar97._20_4_ | (uint)!bVar10 * auVar105._20_4_;
          bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar122._24_4_ = (uint)bVar10 * auVar97._24_4_ | (uint)!bVar10 * auVar105._24_4_;
          bVar10 = SUB81(uVar65 >> 7,0);
          auVar122._28_4_ = (uint)bVar10 * auVar97._28_4_ | (uint)!bVar10 * auVar105._28_4_;
          bVar10 = (bool)((byte)uVar65 & 1);
          auVar123._0_4_ = (float)((uint)bVar10 * auVar95._0_4_ | (uint)!bVar10 * auVar103._0_4_);
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar10 * auVar95._4_4_ | (uint)!bVar10 * auVar103._4_4_);
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar10 * auVar95._8_4_ | (uint)!bVar10 * auVar103._8_4_);
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar10 * auVar95._12_4_ | (uint)!bVar10 * auVar103._12_4_)
          ;
          bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar123._16_4_ = (float)((uint)bVar10 * auVar95._16_4_ | (uint)!bVar10 * auVar103._16_4_)
          ;
          bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar123._20_4_ = (float)((uint)bVar10 * auVar95._20_4_ | (uint)!bVar10 * auVar103._20_4_)
          ;
          bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar123._24_4_ = (float)((uint)bVar10 * auVar95._24_4_ | (uint)!bVar10 * auVar103._24_4_)
          ;
          bVar10 = SUB81(uVar65 >> 7,0);
          auVar123._28_4_ = (uint)bVar10 * auVar95._28_4_ | (uint)!bVar10 * auVar103._28_4_;
          auVar203._8_4_ = 0x80000000;
          auVar203._0_8_ = 0x8000000080000000;
          auVar203._12_4_ = 0x80000000;
          auVar203._16_4_ = 0x80000000;
          auVar203._20_4_ = 0x80000000;
          auVar203._24_4_ = 0x80000000;
          auVar203._28_4_ = 0x80000000;
          auVar106 = vxorps_avx512vl(auVar122,auVar203);
          auVar91 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
          auVar107 = vfmadd213ps_avx512vl(auVar120,auVar120,ZEXT1632(auVar91));
          auVar16 = vfmadd231ps_fma(auVar107,auVar121,auVar121);
          auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar16));
          auVar216._8_4_ = 0xbf000000;
          auVar216._0_8_ = 0xbf000000bf000000;
          auVar216._12_4_ = 0xbf000000;
          auVar216._16_4_ = 0xbf000000;
          auVar216._20_4_ = 0xbf000000;
          auVar216._24_4_ = 0xbf000000;
          auVar216._28_4_ = 0xbf000000;
          fVar156 = auVar107._0_4_;
          fVar195 = auVar107._4_4_;
          fVar196 = auVar107._8_4_;
          fVar197 = auVar107._12_4_;
          fVar198 = auVar107._16_4_;
          fVar168 = auVar107._20_4_;
          fVar70 = auVar107._24_4_;
          auVar42._4_4_ = fVar195 * fVar195 * fVar195 * auVar16._4_4_ * -0.5;
          auVar42._0_4_ = fVar156 * fVar156 * fVar156 * auVar16._0_4_ * -0.5;
          auVar42._8_4_ = fVar196 * fVar196 * fVar196 * auVar16._8_4_ * -0.5;
          auVar42._12_4_ = fVar197 * fVar197 * fVar197 * auVar16._12_4_ * -0.5;
          auVar42._16_4_ = fVar198 * fVar198 * fVar198 * -0.0;
          auVar42._20_4_ = fVar168 * fVar168 * fVar168 * -0.0;
          auVar42._24_4_ = fVar70 * fVar70 * fVar70 * -0.0;
          auVar42._28_4_ = auVar121._28_4_;
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar107 = vfmadd231ps_avx512vl(auVar42,auVar105,auVar107);
          auVar43._4_4_ = auVar121._4_4_ * auVar107._4_4_;
          auVar43._0_4_ = auVar121._0_4_ * auVar107._0_4_;
          auVar43._8_4_ = auVar121._8_4_ * auVar107._8_4_;
          auVar43._12_4_ = auVar121._12_4_ * auVar107._12_4_;
          auVar43._16_4_ = auVar121._16_4_ * auVar107._16_4_;
          auVar43._20_4_ = auVar121._20_4_ * auVar107._20_4_;
          auVar43._24_4_ = auVar121._24_4_ * auVar107._24_4_;
          auVar43._28_4_ = 0;
          auVar44._4_4_ = auVar107._4_4_ * -auVar120._4_4_;
          auVar44._0_4_ = auVar107._0_4_ * -auVar120._0_4_;
          auVar44._8_4_ = auVar107._8_4_ * -auVar120._8_4_;
          auVar44._12_4_ = auVar107._12_4_ * -auVar120._12_4_;
          auVar44._16_4_ = auVar107._16_4_ * -auVar120._16_4_;
          auVar44._20_4_ = auVar107._20_4_ * -auVar120._20_4_;
          auVar44._24_4_ = auVar107._24_4_ * -auVar120._24_4_;
          auVar44._28_4_ = auVar121._28_4_;
          auVar104 = vmulps_avx512vl(auVar107,ZEXT1632(auVar91));
          auVar103 = ZEXT1632(auVar91);
          auVar107 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar103);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar123,auVar123);
          auVar94 = vrsqrt14ps_avx512vl(auVar107);
          auVar107 = vmulps_avx512vl(auVar107,auVar216);
          fVar156 = auVar94._0_4_;
          fVar195 = auVar94._4_4_;
          fVar196 = auVar94._8_4_;
          fVar197 = auVar94._12_4_;
          fVar198 = auVar94._16_4_;
          fVar168 = auVar94._20_4_;
          fVar70 = auVar94._24_4_;
          auVar45._4_4_ = fVar195 * fVar195 * fVar195 * auVar107._4_4_;
          auVar45._0_4_ = fVar156 * fVar156 * fVar156 * auVar107._0_4_;
          auVar45._8_4_ = fVar196 * fVar196 * fVar196 * auVar107._8_4_;
          auVar45._12_4_ = fVar197 * fVar197 * fVar197 * auVar107._12_4_;
          auVar45._16_4_ = fVar198 * fVar198 * fVar198 * auVar107._16_4_;
          auVar45._20_4_ = fVar168 * fVar168 * fVar168 * auVar107._20_4_;
          auVar45._24_4_ = fVar70 * fVar70 * fVar70 * auVar107._24_4_;
          auVar45._28_4_ = auVar107._28_4_;
          auVar107 = vfmadd231ps_avx512vl(auVar45,auVar105,auVar94);
          auVar46._4_4_ = auVar123._4_4_ * auVar107._4_4_;
          auVar46._0_4_ = auVar123._0_4_ * auVar107._0_4_;
          auVar46._8_4_ = auVar123._8_4_ * auVar107._8_4_;
          auVar46._12_4_ = auVar123._12_4_ * auVar107._12_4_;
          auVar46._16_4_ = auVar123._16_4_ * auVar107._16_4_;
          auVar46._20_4_ = auVar123._20_4_ * auVar107._20_4_;
          auVar46._24_4_ = auVar123._24_4_ * auVar107._24_4_;
          auVar46._28_4_ = auVar94._28_4_;
          auVar47._4_4_ = auVar107._4_4_ * auVar106._4_4_;
          auVar47._0_4_ = auVar107._0_4_ * auVar106._0_4_;
          auVar47._8_4_ = auVar107._8_4_ * auVar106._8_4_;
          auVar47._12_4_ = auVar107._12_4_ * auVar106._12_4_;
          auVar47._16_4_ = auVar107._16_4_ * auVar106._16_4_;
          auVar47._20_4_ = auVar107._20_4_ * auVar106._20_4_;
          auVar47._24_4_ = auVar107._24_4_ * auVar106._24_4_;
          auVar47._28_4_ = auVar106._28_4_;
          auVar106 = vmulps_avx512vl(auVar107,auVar103);
          auVar16 = vfmadd213ps_fma(auVar43,auVar96,ZEXT1632(auVar83));
          auVar80 = vfmadd213ps_fma(auVar44,auVar96,ZEXT1632(auVar88));
          auVar105 = vfmadd213ps_avx512vl(auVar104,auVar96,auVar93);
          auVar94 = vfmadd213ps_avx512vl(auVar46,auVar98,ZEXT1632(auVar85));
          auVar77 = vfnmadd213ps_fma(auVar43,auVar96,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar47,auVar98,ZEXT1632(auVar84));
          auVar78 = vfnmadd213ps_fma(auVar44,auVar96,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(auVar106,auVar98,auVar92);
          auVar82 = vfnmadd231ps_fma(auVar93,auVar96,auVar104);
          auVar79 = vfnmadd213ps_fma(auVar46,auVar98,ZEXT1632(auVar85));
          auVar81 = vfnmadd213ps_fma(auVar47,auVar98,ZEXT1632(auVar84));
          auVar17 = vfnmadd231ps_fma(auVar92,auVar98,auVar106);
          auVar92 = vsubps_avx512vl(auVar94,ZEXT1632(auVar77));
          auVar106 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar78));
          auVar107 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar82));
          auVar48._4_4_ = auVar106._4_4_ * auVar82._4_4_;
          auVar48._0_4_ = auVar106._0_4_ * auVar82._0_4_;
          auVar48._8_4_ = auVar106._8_4_ * auVar82._8_4_;
          auVar48._12_4_ = auVar106._12_4_ * auVar82._12_4_;
          auVar48._16_4_ = auVar106._16_4_ * 0.0;
          auVar48._20_4_ = auVar106._20_4_ * 0.0;
          auVar48._24_4_ = auVar106._24_4_ * 0.0;
          auVar48._28_4_ = auVar104._28_4_;
          auVar85 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar78),auVar107);
          auVar49._4_4_ = auVar107._4_4_ * auVar77._4_4_;
          auVar49._0_4_ = auVar107._0_4_ * auVar77._0_4_;
          auVar49._8_4_ = auVar107._8_4_ * auVar77._8_4_;
          auVar49._12_4_ = auVar107._12_4_ * auVar77._12_4_;
          auVar49._16_4_ = auVar107._16_4_ * 0.0;
          auVar49._20_4_ = auVar107._20_4_ * 0.0;
          auVar49._24_4_ = auVar107._24_4_ * 0.0;
          auVar49._28_4_ = auVar107._28_4_;
          auVar84 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar82),auVar92);
          auVar50._4_4_ = auVar78._4_4_ * auVar92._4_4_;
          auVar50._0_4_ = auVar78._0_4_ * auVar92._0_4_;
          auVar50._8_4_ = auVar78._8_4_ * auVar92._8_4_;
          auVar50._12_4_ = auVar78._12_4_ * auVar92._12_4_;
          auVar50._16_4_ = auVar92._16_4_ * 0.0;
          auVar50._20_4_ = auVar92._20_4_ * 0.0;
          auVar50._24_4_ = auVar92._24_4_ * 0.0;
          auVar50._28_4_ = auVar92._28_4_;
          auVar76 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar77),auVar106);
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar103,ZEXT1632(auVar84));
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,ZEXT1632(auVar85));
          auVar100 = ZEXT1632(auVar91);
          uVar65 = vcmpps_avx512vl(auVar106,auVar100,2);
          bVar58 = (byte)uVar65;
          fVar133 = (float)((uint)(bVar58 & 1) * auVar16._0_4_ |
                           (uint)!(bool)(bVar58 & 1) * auVar79._0_4_);
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          fVar135 = (float)((uint)bVar10 * auVar16._4_4_ | (uint)!bVar10 * auVar79._4_4_);
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          fVar138 = (float)((uint)bVar10 * auVar16._8_4_ | (uint)!bVar10 * auVar79._8_4_);
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          fVar139 = (float)((uint)bVar10 * auVar16._12_4_ | (uint)!bVar10 * auVar79._12_4_);
          auVar103 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar138,CONCAT44(fVar135,fVar133))));
          fVar134 = (float)((uint)(bVar58 & 1) * auVar80._0_4_ |
                           (uint)!(bool)(bVar58 & 1) * auVar81._0_4_);
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          fVar137 = (float)((uint)bVar10 * auVar80._4_4_ | (uint)!bVar10 * auVar81._4_4_);
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          fVar136 = (float)((uint)bVar10 * auVar80._8_4_ | (uint)!bVar10 * auVar81._8_4_);
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          fVar140 = (float)((uint)bVar10 * auVar80._12_4_ | (uint)!bVar10 * auVar81._12_4_);
          auVar97 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar136,CONCAT44(fVar137,fVar134))));
          auVar124._0_4_ =
               (float)((uint)(bVar58 & 1) * auVar105._0_4_ |
                      (uint)!(bool)(bVar58 & 1) * auVar17._0_4_);
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar17._4_4_);
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar17._8_4_);
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar17._12_4_)
          ;
          fVar156 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar105._16_4_);
          auVar124._16_4_ = fVar156;
          fVar195 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar105._20_4_);
          auVar124._20_4_ = fVar195;
          fVar196 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar105._24_4_);
          auVar124._24_4_ = fVar196;
          iVar1 = (uint)(byte)(uVar65 >> 7) * auVar105._28_4_;
          auVar124._28_4_ = iVar1;
          auVar106 = vblendmps_avx512vl(ZEXT1632(auVar77),auVar94);
          auVar125._0_4_ =
               (uint)(bVar58 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar85._0_4_;
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * auVar85._4_4_;
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * auVar85._8_4_;
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * auVar85._12_4_;
          auVar125._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * auVar106._16_4_;
          auVar125._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * auVar106._20_4_;
          auVar125._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * auVar106._24_4_;
          auVar125._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar106._28_4_;
          auVar106 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar83));
          auVar126._0_4_ =
               (float)((uint)(bVar58 & 1) * auVar106._0_4_ |
                      (uint)!(bool)(bVar58 & 1) * auVar16._0_4_);
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * auVar16._4_4_);
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * auVar16._8_4_);
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * auVar16._12_4_)
          ;
          fVar168 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar106._16_4_);
          auVar126._16_4_ = fVar168;
          fVar198 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar106._20_4_);
          auVar126._20_4_ = fVar198;
          fVar197 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar106._24_4_);
          auVar126._24_4_ = fVar197;
          auVar126._28_4_ = (uint)(byte)(uVar65 >> 7) * auVar106._28_4_;
          auVar106 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar88));
          auVar127._0_4_ =
               (float)((uint)(bVar58 & 1) * auVar106._0_4_ |
                      (uint)!(bool)(bVar58 & 1) * auVar80._0_4_);
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * auVar80._4_4_);
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * auVar80._8_4_);
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * auVar80._12_4_)
          ;
          fVar70 = (float)((uint)((byte)(uVar65 >> 4) & 1) * auVar106._16_4_);
          auVar127._16_4_ = fVar70;
          fVar132 = (float)((uint)((byte)(uVar65 >> 5) & 1) * auVar106._20_4_);
          auVar127._20_4_ = fVar132;
          fVar71 = (float)((uint)((byte)(uVar65 >> 6) & 1) * auVar106._24_4_);
          auVar127._24_4_ = fVar71;
          iVar2 = (uint)(byte)(uVar65 >> 7) * auVar106._28_4_;
          auVar127._28_4_ = iVar2;
          auVar128._0_4_ =
               (uint)(bVar58 & 1) * (int)auVar77._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar94._0_4_;
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar10 * (int)auVar77._4_4_ | (uint)!bVar10 * auVar94._4_4_;
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar10 * (int)auVar77._8_4_ | (uint)!bVar10 * auVar94._8_4_;
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar10 * (int)auVar77._12_4_ | (uint)!bVar10 * auVar94._12_4_;
          auVar128._16_4_ = (uint)!(bool)((byte)(uVar65 >> 4) & 1) * auVar94._16_4_;
          auVar128._20_4_ = (uint)!(bool)((byte)(uVar65 >> 5) & 1) * auVar94._20_4_;
          auVar128._24_4_ = (uint)!(bool)((byte)(uVar65 >> 6) & 1) * auVar94._24_4_;
          auVar128._28_4_ = (uint)!SUB81(uVar65 >> 7,0) * auVar94._28_4_;
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar65 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar94 = vsubps_avx512vl(auVar128,auVar103);
          auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar78._12_4_ |
                                                   (uint)!bVar14 * auVar83._12_4_,
                                                   CONCAT48((uint)bVar12 * (int)auVar78._8_4_ |
                                                            (uint)!bVar12 * auVar83._8_4_,
                                                            CONCAT44((uint)bVar10 *
                                                                     (int)auVar78._4_4_ |
                                                                     (uint)!bVar10 * auVar83._4_4_,
                                                                     (uint)(bVar58 & 1) *
                                                                     (int)auVar78._0_4_ |
                                                                     (uint)!(bool)(bVar58 & 1) *
                                                                     auVar83._0_4_)))),auVar97);
          auVar189 = ZEXT3264(auVar107);
          auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar82._12_4_ |
                                                   (uint)!bVar15 * auVar88._12_4_,
                                                   CONCAT48((uint)bVar13 * (int)auVar82._8_4_ |
                                                            (uint)!bVar13 * auVar88._8_4_,
                                                            CONCAT44((uint)bVar11 *
                                                                     (int)auVar82._4_4_ |
                                                                     (uint)!bVar11 * auVar88._4_4_,
                                                                     (uint)(bVar58 & 1) *
                                                                     (int)auVar82._0_4_ |
                                                                     (uint)!(bool)(bVar58 & 1) *
                                                                     auVar88._0_4_)))),auVar124);
          auVar104 = vsubps_avx(auVar103,auVar125);
          auVar192 = ZEXT3264(auVar104);
          auVar92 = vsubps_avx(auVar97,auVar126);
          auVar93 = vsubps_avx(auVar124,auVar127);
          auVar51._4_4_ = auVar105._4_4_ * fVar135;
          auVar51._0_4_ = auVar105._0_4_ * fVar133;
          auVar51._8_4_ = auVar105._8_4_ * fVar138;
          auVar51._12_4_ = auVar105._12_4_ * fVar139;
          auVar51._16_4_ = auVar105._16_4_ * 0.0;
          auVar51._20_4_ = auVar105._20_4_ * 0.0;
          auVar51._24_4_ = auVar105._24_4_ * 0.0;
          auVar51._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar51,auVar124,auVar94);
          auVar172._0_4_ = fVar134 * auVar94._0_4_;
          auVar172._4_4_ = fVar137 * auVar94._4_4_;
          auVar172._8_4_ = fVar136 * auVar94._8_4_;
          auVar172._12_4_ = fVar140 * auVar94._12_4_;
          auVar172._16_4_ = auVar94._16_4_ * 0.0;
          auVar172._20_4_ = auVar94._20_4_ * 0.0;
          auVar172._24_4_ = auVar94._24_4_ * 0.0;
          auVar172._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar172,auVar103,auVar107);
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar100,ZEXT1632(auVar83));
          auVar184._0_4_ = auVar107._0_4_ * auVar124._0_4_;
          auVar184._4_4_ = auVar107._4_4_ * auVar124._4_4_;
          auVar184._8_4_ = auVar107._8_4_ * auVar124._8_4_;
          auVar184._12_4_ = auVar107._12_4_ * auVar124._12_4_;
          auVar184._16_4_ = auVar107._16_4_ * fVar156;
          auVar184._20_4_ = auVar107._20_4_ * fVar195;
          auVar184._24_4_ = auVar107._24_4_ * fVar196;
          auVar184._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar184,auVar97,auVar105);
          auVar95 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar83));
          auVar106 = vmulps_avx512vl(auVar93,auVar125);
          auVar106 = vfmsub231ps_avx512vl(auVar106,auVar104,auVar127);
          auVar52._4_4_ = auVar92._4_4_ * auVar127._4_4_;
          auVar52._0_4_ = auVar92._0_4_ * auVar127._0_4_;
          auVar52._8_4_ = auVar92._8_4_ * auVar127._8_4_;
          auVar52._12_4_ = auVar92._12_4_ * auVar127._12_4_;
          auVar52._16_4_ = auVar92._16_4_ * fVar70;
          auVar52._20_4_ = auVar92._20_4_ * fVar132;
          auVar52._24_4_ = auVar92._24_4_ * fVar71;
          auVar52._28_4_ = iVar2;
          auVar83 = vfmsub231ps_fma(auVar52,auVar126,auVar93);
          auVar185._0_4_ = auVar126._0_4_ * auVar104._0_4_;
          auVar185._4_4_ = auVar126._4_4_ * auVar104._4_4_;
          auVar185._8_4_ = auVar126._8_4_ * auVar104._8_4_;
          auVar185._12_4_ = auVar126._12_4_ * auVar104._12_4_;
          auVar185._16_4_ = fVar168 * auVar104._16_4_;
          auVar185._20_4_ = fVar198 * auVar104._20_4_;
          auVar185._24_4_ = fVar197 * auVar104._24_4_;
          auVar185._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar185,auVar92,auVar125);
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar100,auVar106);
          auVar99 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar83));
          auVar186 = ZEXT3264(auVar99);
          auVar106 = vmaxps_avx(auVar95,auVar99);
          uVar149 = vcmpps_avx512vl(auVar106,auVar100,2);
          bVar67 = bVar67 & (byte)uVar149;
          if (bVar67 != 0) {
            auVar53._4_4_ = auVar93._4_4_ * auVar107._4_4_;
            auVar53._0_4_ = auVar93._0_4_ * auVar107._0_4_;
            auVar53._8_4_ = auVar93._8_4_ * auVar107._8_4_;
            auVar53._12_4_ = auVar93._12_4_ * auVar107._12_4_;
            auVar53._16_4_ = auVar93._16_4_ * auVar107._16_4_;
            auVar53._20_4_ = auVar93._20_4_ * auVar107._20_4_;
            auVar53._24_4_ = auVar93._24_4_ * auVar107._24_4_;
            auVar53._28_4_ = auVar106._28_4_;
            auVar84 = vfmsub231ps_fma(auVar53,auVar92,auVar105);
            auVar54._4_4_ = auVar105._4_4_ * auVar104._4_4_;
            auVar54._0_4_ = auVar105._0_4_ * auVar104._0_4_;
            auVar54._8_4_ = auVar105._8_4_ * auVar104._8_4_;
            auVar54._12_4_ = auVar105._12_4_ * auVar104._12_4_;
            auVar54._16_4_ = auVar105._16_4_ * auVar104._16_4_;
            auVar54._20_4_ = auVar105._20_4_ * auVar104._20_4_;
            auVar54._24_4_ = auVar105._24_4_ * auVar104._24_4_;
            auVar54._28_4_ = auVar105._28_4_;
            auVar85 = vfmsub231ps_fma(auVar54,auVar94,auVar93);
            auVar55._4_4_ = auVar92._4_4_ * auVar94._4_4_;
            auVar55._0_4_ = auVar92._0_4_ * auVar94._0_4_;
            auVar55._8_4_ = auVar92._8_4_ * auVar94._8_4_;
            auVar55._12_4_ = auVar92._12_4_ * auVar94._12_4_;
            auVar55._16_4_ = auVar92._16_4_ * auVar94._16_4_;
            auVar55._20_4_ = auVar92._20_4_ * auVar94._20_4_;
            auVar55._24_4_ = auVar92._24_4_ * auVar94._24_4_;
            auVar55._28_4_ = auVar92._28_4_;
            auVar16 = vfmsub231ps_fma(auVar55,auVar104,auVar107);
            auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar16));
            auVar88 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar84),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar106 = vrcp14ps_avx512vl(ZEXT1632(auVar88));
            auVar30._8_4_ = 0x3f800000;
            auVar30._0_8_ = 0x3f8000003f800000;
            auVar30._12_4_ = 0x3f800000;
            auVar30._16_4_ = 0x3f800000;
            auVar30._20_4_ = 0x3f800000;
            auVar30._24_4_ = 0x3f800000;
            auVar30._28_4_ = 0x3f800000;
            auVar107 = vfnmadd213ps_avx512vl(auVar106,ZEXT1632(auVar88),auVar30);
            auVar83 = vfmadd132ps_fma(auVar107,auVar106,auVar106);
            auVar189 = ZEXT1664(auVar83);
            auVar56._4_4_ = auVar16._4_4_ * auVar124._4_4_;
            auVar56._0_4_ = auVar16._0_4_ * auVar124._0_4_;
            auVar56._8_4_ = auVar16._8_4_ * auVar124._8_4_;
            auVar56._12_4_ = auVar16._12_4_ * auVar124._12_4_;
            auVar56._16_4_ = fVar156 * 0.0;
            auVar56._20_4_ = fVar195 * 0.0;
            auVar56._24_4_ = fVar196 * 0.0;
            auVar56._28_4_ = iVar1;
            auVar85 = vfmadd231ps_fma(auVar56,auVar97,ZEXT1632(auVar85));
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar103,ZEXT1632(auVar84));
            fVar195 = auVar83._0_4_;
            fVar196 = auVar83._4_4_;
            fVar197 = auVar83._8_4_;
            fVar198 = auVar83._12_4_;
            local_240._28_4_ = auVar106._28_4_;
            local_240._0_28_ =
                 ZEXT1628(CONCAT412(auVar85._12_4_ * fVar198,
                                    CONCAT48(auVar85._8_4_ * fVar197,
                                             CONCAT44(auVar85._4_4_ * fVar196,
                                                      auVar85._0_4_ * fVar195))));
            auVar192 = ZEXT3264(local_240);
            uVar149 = vcmpps_avx512vl(local_240,local_3a0,0xd);
            fVar156 = (ray->super_RayK<1>).tfar;
            auVar31._4_4_ = fVar156;
            auVar31._0_4_ = fVar156;
            auVar31._8_4_ = fVar156;
            auVar31._12_4_ = fVar156;
            auVar31._16_4_ = fVar156;
            auVar31._20_4_ = fVar156;
            auVar31._24_4_ = fVar156;
            auVar31._28_4_ = fVar156;
            uVar20 = vcmpps_avx512vl(local_240,auVar31,2);
            bVar67 = (byte)uVar149 & (byte)uVar20 & bVar67;
            if (bVar67 != 0) {
              uVar69 = vcmpps_avx512vl(ZEXT1632(auVar88),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar69 = bVar67 & uVar69;
              if ((char)uVar69 != '\0') {
                fVar156 = auVar95._0_4_ * fVar195;
                fVar168 = auVar95._4_4_ * fVar196;
                auVar57._4_4_ = fVar168;
                auVar57._0_4_ = fVar156;
                fVar70 = auVar95._8_4_ * fVar197;
                auVar57._8_4_ = fVar70;
                fVar71 = auVar95._12_4_ * fVar198;
                auVar57._12_4_ = fVar71;
                fVar132 = auVar95._16_4_ * 0.0;
                auVar57._16_4_ = fVar132;
                fVar133 = auVar95._20_4_ * 0.0;
                auVar57._20_4_ = fVar133;
                fVar134 = auVar95._24_4_ * 0.0;
                auVar57._24_4_ = fVar134;
                auVar57._28_4_ = auVar95._28_4_;
                auVar167._8_4_ = 0x3f800000;
                auVar167._0_8_ = 0x3f8000003f800000;
                auVar167._12_4_ = 0x3f800000;
                auVar167._16_4_ = 0x3f800000;
                auVar167._20_4_ = 0x3f800000;
                auVar167._24_4_ = 0x3f800000;
                auVar167._28_4_ = 0x3f800000;
                auVar106 = vsubps_avx(auVar167,auVar57);
                local_280._0_4_ =
                     (float)((uint)(bVar58 & 1) * (int)fVar156 |
                            (uint)!(bool)(bVar58 & 1) * auVar106._0_4_);
                bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar10 * (int)fVar168 | (uint)!bVar10 * auVar106._4_4_);
                bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar10 * (int)fVar70 | (uint)!bVar10 * auVar106._8_4_);
                bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar10 * (int)fVar71 | (uint)!bVar10 * auVar106._12_4_);
                bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar10 * (int)fVar132 | (uint)!bVar10 * auVar106._16_4_);
                bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar10 * (int)fVar133 | (uint)!bVar10 * auVar106._20_4_);
                bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar10 * (int)fVar134 | (uint)!bVar10 * auVar106._24_4_);
                bVar10 = SUB81(uVar65 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar10 * auVar95._28_4_ | (uint)!bVar10 * auVar106._28_4_);
                auVar106 = vsubps_avx(auVar98,auVar96);
                auVar83 = vfmadd213ps_fma(auVar106,local_280,auVar96);
                fVar156 = local_508->depth_scale;
                auVar32._4_4_ = fVar156;
                auVar32._0_4_ = fVar156;
                auVar32._8_4_ = fVar156;
                auVar32._12_4_ = fVar156;
                auVar32._16_4_ = fVar156;
                auVar32._20_4_ = fVar156;
                auVar32._24_4_ = fVar156;
                auVar32._28_4_ = fVar156;
                auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                              CONCAT48(auVar83._8_4_ + auVar83._8_4_
                                                                       ,CONCAT44(auVar83._4_4_ +
                                                                                 auVar83._4_4_,
                                                                                 auVar83._0_4_ +
                                                                                 auVar83._0_4_)))),
                                           auVar32);
                uVar19 = vcmpps_avx512vl(local_240,auVar106,6);
                uVar69 = uVar69 & uVar19;
                uVar68 = (uint)uVar69;
                bVar67 = (byte)uVar69;
                if (bVar67 != 0) {
                  auVar155._0_4_ = auVar99._0_4_ * fVar195;
                  auVar155._4_4_ = auVar99._4_4_ * fVar196;
                  auVar155._8_4_ = auVar99._8_4_ * fVar197;
                  auVar155._12_4_ = auVar99._12_4_ * fVar198;
                  auVar155._16_4_ = auVar99._16_4_ * 0.0;
                  auVar155._20_4_ = auVar99._20_4_ * 0.0;
                  auVar155._24_4_ = auVar99._24_4_ * 0.0;
                  auVar155._28_4_ = 0;
                  auVar173._8_4_ = 0x3f800000;
                  auVar173._0_8_ = 0x3f8000003f800000;
                  auVar173._12_4_ = 0x3f800000;
                  auVar173._16_4_ = 0x3f800000;
                  auVar173._20_4_ = 0x3f800000;
                  auVar173._24_4_ = 0x3f800000;
                  auVar173._28_4_ = 0x3f800000;
                  auVar106 = vsubps_avx(auVar173,auVar155);
                  auVar129._0_4_ =
                       (uint)(bVar58 & 1) * (int)auVar155._0_4_ |
                       (uint)!(bool)(bVar58 & 1) * auVar106._0_4_;
                  bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
                  auVar129._4_4_ =
                       (uint)bVar10 * (int)auVar155._4_4_ | (uint)!bVar10 * auVar106._4_4_;
                  bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
                  auVar129._8_4_ =
                       (uint)bVar10 * (int)auVar155._8_4_ | (uint)!bVar10 * auVar106._8_4_;
                  bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
                  auVar129._12_4_ =
                       (uint)bVar10 * (int)auVar155._12_4_ | (uint)!bVar10 * auVar106._12_4_;
                  bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
                  auVar129._16_4_ =
                       (uint)bVar10 * (int)auVar155._16_4_ | (uint)!bVar10 * auVar106._16_4_;
                  bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
                  auVar129._20_4_ =
                       (uint)bVar10 * (int)auVar155._20_4_ | (uint)!bVar10 * auVar106._20_4_;
                  bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
                  auVar129._24_4_ =
                       (uint)bVar10 * (int)auVar155._24_4_ | (uint)!bVar10 * auVar106._24_4_;
                  auVar129._28_4_ = (uint)!SUB81(uVar65 >> 7,0) * auVar106._28_4_;
                  auVar33._8_4_ = 0x40000000;
                  auVar33._0_8_ = 0x4000000040000000;
                  auVar33._12_4_ = 0x40000000;
                  auVar33._16_4_ = 0x40000000;
                  auVar33._20_4_ = 0x40000000;
                  auVar33._24_4_ = 0x40000000;
                  auVar33._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar129,auVar173,auVar33);
                  local_220 = (int)lVar61;
                  local_21c = iVar7;
                  local_210 = local_4a0._0_8_;
                  uStack_208 = local_4a0._8_8_;
                  local_200 = local_4b0._0_8_;
                  uStack_1f8 = local_4b0._8_8_;
                  local_1f0 = local_4c0._0_8_;
                  uStack_1e8 = local_4c0._8_8_;
                  local_1e0 = local_4d0;
                  uStack_1d8 = uStack_4c8;
                  pGVar64 = (context->scene->geometries).items[local_528].ptr;
                  if ((pGVar64->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar83 = vcvtsi2ss_avx512f(auVar91,(int)lVar61);
                    fVar156 = auVar83._0_4_;
                    local_1c0[0] = (fVar156 + local_280._0_4_ + 0.0) * local_100;
                    local_1c0[1] = (fVar156 + local_280._4_4_ + 1.0) * fStack_fc;
                    local_1c0[2] = (fVar156 + local_280._8_4_ + 2.0) * fStack_f8;
                    local_1c0[3] = (fVar156 + local_280._12_4_ + 3.0) * fStack_f4;
                    fStack_1b0 = (fVar156 + local_280._16_4_ + 4.0) * fStack_f0;
                    fStack_1ac = (fVar156 + local_280._20_4_ + 5.0) * fStack_ec;
                    fStack_1a8 = (fVar156 + local_280._24_4_ + 6.0) * fStack_e8;
                    fStack_1a4 = fVar156 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    auVar146._8_4_ = 0x7f800000;
                    auVar146._0_8_ = 0x7f8000007f800000;
                    auVar146._12_4_ = 0x7f800000;
                    auVar146._16_4_ = 0x7f800000;
                    auVar146._20_4_ = 0x7f800000;
                    auVar146._24_4_ = 0x7f800000;
                    auVar146._28_4_ = 0x7f800000;
                    auVar106 = vblendmps_avx512vl(auVar146,local_240);
                    auVar130._0_4_ =
                         (uint)(bVar67 & 1) * auVar106._0_4_ |
                         (uint)!(bool)(bVar67 & 1) * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
                    auVar130._4_4_ = (uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
                    auVar130._8_4_ = (uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
                    auVar130._12_4_ = (uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
                    auVar130._16_4_ = (uint)bVar10 * auVar106._16_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
                    auVar130._20_4_ = (uint)bVar10 * auVar106._20_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
                    auVar130._24_4_ = (uint)bVar10 * auVar106._24_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = SUB81(uVar69 >> 7,0);
                    auVar130._28_4_ = (uint)bVar10 * auVar106._28_4_ | (uint)!bVar10 * 0x7f800000;
                    auVar106 = vshufps_avx(auVar130,auVar130,0xb1);
                    auVar106 = vminps_avx(auVar130,auVar106);
                    auVar107 = vshufpd_avx(auVar106,auVar106,5);
                    auVar106 = vminps_avx(auVar106,auVar107);
                    auVar107 = vpermpd_avx2(auVar106,0x4e);
                    auVar106 = vminps_avx(auVar106,auVar107);
                    uVar149 = vcmpps_avx512vl(auVar130,auVar106,0);
                    if ((bVar67 & (byte)uVar149) != 0) {
                      uVar68 = (uint)(bVar67 & (byte)uVar149);
                    }
                    uVar60 = 0;
                    for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                      uVar60 = uVar60 + 1;
                    }
                    uVar65 = (ulong)uVar60;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar64->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_420 = local_240;
                      local_458 = pGVar64;
                      do {
                        local_484 = local_1c0[uVar65];
                        local_480 = *(undefined4 *)(local_1a0 + uVar65 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar65 * 4);
                        local_500.context = context->user;
                        fVar156 = 1.0 - local_484;
                        auVar25._8_4_ = 0x80000000;
                        auVar25._0_8_ = 0x8000000080000000;
                        auVar25._12_4_ = 0x80000000;
                        auVar85 = vxorps_avx512vl(ZEXT416((uint)fVar156),auVar25);
                        auVar83 = ZEXT416((uint)(local_484 * fVar156 * 4.0));
                        auVar88 = vfnmsub213ss_fma(ZEXT416((uint)local_484),ZEXT416((uint)local_484)
                                                   ,auVar83);
                        auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),
                                                  auVar83);
                        fVar156 = fVar156 * auVar85._0_4_ * 0.5;
                        fVar195 = auVar88._0_4_ * 0.5;
                        auVar189 = ZEXT464((uint)fVar195);
                        fVar196 = auVar83._0_4_ * 0.5;
                        fVar197 = local_484 * local_484 * 0.5;
                        auVar178._0_4_ = fVar197 * (float)local_4d0._0_4_;
                        auVar178._4_4_ = fVar197 * (float)local_4d0._4_4_;
                        auVar178._8_4_ = fVar197 * (float)uStack_4c8;
                        auVar178._12_4_ = fVar197 * uStack_4c8._4_4_;
                        auVar162._4_4_ = fVar196;
                        auVar162._0_4_ = fVar196;
                        auVar162._8_4_ = fVar196;
                        auVar162._12_4_ = fVar196;
                        auVar83 = vfmadd132ps_fma(auVar162,auVar178,local_4c0);
                        auVar179._4_4_ = fVar195;
                        auVar179._0_4_ = fVar195;
                        auVar179._8_4_ = fVar195;
                        auVar179._12_4_ = fVar195;
                        auVar83 = vfmadd132ps_fma(auVar179,auVar83,local_4b0);
                        auVar186 = ZEXT1664(auVar83);
                        auVar163._4_4_ = fVar156;
                        auVar163._0_4_ = fVar156;
                        auVar163._8_4_ = fVar156;
                        auVar163._12_4_ = fVar156;
                        auVar88 = vfmadd132ps_fma(auVar163,auVar83,local_4a0);
                        local_490 = vmovlps_avx(auVar88);
                        local_488 = vextractps_avx(auVar88,2);
                        local_47c = (int)local_518;
                        local_478 = (int)local_528;
                        local_474 = (local_500.context)->instID[0];
                        local_470 = (local_500.context)->instPrimID[0];
                        local_53c = -1;
                        local_500.valid = &local_53c;
                        local_500.geometryUserPtr = pGVar64->userPtr;
                        local_500.ray = (RTCRayN *)ray;
                        local_500.hit = (RTCHitN *)&local_490;
                        local_500.N = 1;
                        if (pGVar64->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018e229f:
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar64->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar186 = ZEXT1664(auVar186._0_16_);
                            auVar189 = ZEXT1664(auVar189._0_16_);
                            (*p_Var9)(&local_500);
                            auVar192 = ZEXT3264(local_420);
                            ray = local_530;
                            pGVar64 = local_458;
                            if (*local_500.valid == 0) goto LAB_018e233d;
                          }
                          (((Vec3f *)((long)local_500.ray + 0x30))->field_0).components[0] =
                               *(float *)local_500.hit;
                          (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_500.hit + 4);
                          (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_500.hit + 8);
                          *(float *)((long)local_500.ray + 0x3c) = *(float *)(local_500.hit + 0xc);
                          *(float *)((long)local_500.ray + 0x40) = *(float *)(local_500.hit + 0x10);
                          *(float *)((long)local_500.ray + 0x44) = *(float *)(local_500.hit + 0x14);
                          *(float *)((long)local_500.ray + 0x48) = *(float *)(local_500.hit + 0x18);
                          *(float *)((long)local_500.ray + 0x4c) = *(float *)(local_500.hit + 0x1c);
                          *(float *)((long)local_500.ray + 0x50) = *(float *)(local_500.hit + 0x20);
                        }
                        else {
                          auVar186 = ZEXT1664(auVar83);
                          auVar189 = ZEXT464((uint)fVar195);
                          (*pGVar64->intersectionFilterN)(&local_500);
                          auVar192 = ZEXT3264(local_420);
                          ray = local_530;
                          pGVar64 = local_458;
                          if (*local_500.valid != 0) goto LAB_018e229f;
LAB_018e233d:
                          (local_530->super_RayK<1>).tfar = (float)local_400._0_4_;
                          ray = local_530;
                          pGVar64 = local_458;
                        }
                        bVar67 = ~(byte)(1 << ((uint)uVar65 & 0x1f)) & (byte)uVar69;
                        fVar156 = (ray->super_RayK<1>).tfar;
                        auVar34._4_4_ = fVar156;
                        auVar34._0_4_ = fVar156;
                        auVar34._8_4_ = fVar156;
                        auVar34._12_4_ = fVar156;
                        auVar34._16_4_ = fVar156;
                        auVar34._20_4_ = fVar156;
                        auVar34._24_4_ = fVar156;
                        auVar34._28_4_ = fVar156;
                        uVar149 = vcmpps_avx512vl(auVar192._0_32_,auVar34,2);
                        if ((bVar67 & (byte)uVar149) == 0) goto LAB_018e23d9;
                        local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar67 = bVar67 & (byte)uVar149;
                        uVar69 = (ulong)bVar67;
                        auVar147._8_4_ = 0x7f800000;
                        auVar147._0_8_ = 0x7f8000007f800000;
                        auVar147._12_4_ = 0x7f800000;
                        auVar147._16_4_ = 0x7f800000;
                        auVar147._20_4_ = 0x7f800000;
                        auVar147._24_4_ = 0x7f800000;
                        auVar147._28_4_ = 0x7f800000;
                        auVar106 = vblendmps_avx512vl(auVar147,auVar192._0_32_);
                        auVar131._0_4_ =
                             (uint)(bVar67 & 1) * auVar106._0_4_ |
                             (uint)!(bool)(bVar67 & 1) * 0x7f800000;
                        bVar10 = (bool)(bVar67 >> 1 & 1);
                        auVar131._4_4_ = (uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar67 >> 2 & 1);
                        auVar131._8_4_ = (uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar67 >> 3 & 1);
                        auVar131._12_4_ =
                             (uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar67 >> 4 & 1);
                        auVar131._16_4_ =
                             (uint)bVar10 * auVar106._16_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar67 >> 5 & 1);
                        auVar131._20_4_ =
                             (uint)bVar10 * auVar106._20_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar67 >> 6 & 1);
                        auVar131._24_4_ =
                             (uint)bVar10 * auVar106._24_4_ | (uint)!bVar10 * 0x7f800000;
                        auVar131._28_4_ =
                             (uint)(bVar67 >> 7) * auVar106._28_4_ |
                             (uint)!(bool)(bVar67 >> 7) * 0x7f800000;
                        auVar106 = vshufps_avx(auVar131,auVar131,0xb1);
                        auVar106 = vminps_avx(auVar131,auVar106);
                        auVar107 = vshufpd_avx(auVar106,auVar106,5);
                        auVar106 = vminps_avx(auVar106,auVar107);
                        auVar107 = vpermpd_avx2(auVar106,0x4e);
                        auVar106 = vminps_avx(auVar106,auVar107);
                        uVar149 = vcmpps_avx512vl(auVar131,auVar106,0);
                        bVar58 = (byte)uVar149 & bVar67;
                        if (bVar58 != 0) {
                          bVar67 = bVar58;
                        }
                        uVar68 = 0;
                        for (uVar60 = (uint)bVar67; (uVar60 & 1) == 0;
                            uVar60 = uVar60 >> 1 | 0x80000000) {
                          uVar68 = uVar68 + 1;
                        }
                        uVar65 = (ulong)uVar68;
                      } while( true );
                    }
                    fVar156 = local_1c0[uVar65];
                    fVar195 = *(float *)(local_1a0 + uVar65 * 4);
                    fVar196 = 1.0 - fVar156;
                    auVar24._8_4_ = 0x80000000;
                    auVar24._0_8_ = 0x8000000080000000;
                    auVar24._12_4_ = 0x80000000;
                    auVar85 = vxorps_avx512vl(ZEXT416((uint)fVar196),auVar24);
                    auVar83 = ZEXT416((uint)(fVar156 * fVar196 * 4.0));
                    auVar88 = vfnmsub213ss_fma(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),auVar83
                                              );
                    auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),auVar83)
                    ;
                    fVar196 = fVar196 * auVar85._0_4_ * 0.5;
                    fVar197 = auVar88._0_4_ * 0.5;
                    auVar189 = ZEXT464((uint)fVar197);
                    fVar198 = auVar83._0_4_ * 0.5;
                    fVar168 = fVar156 * fVar156 * 0.5;
                    auVar176._0_4_ = fVar168 * (float)local_4d0._0_4_;
                    auVar176._4_4_ = fVar168 * (float)local_4d0._4_4_;
                    auVar176._8_4_ = fVar168 * (float)uStack_4c8;
                    auVar176._12_4_ = fVar168 * uStack_4c8._4_4_;
                    auVar160._4_4_ = fVar198;
                    auVar160._0_4_ = fVar198;
                    auVar160._8_4_ = fVar198;
                    auVar160._12_4_ = fVar198;
                    auVar83 = vfmadd132ps_fma(auVar160,auVar176,local_4c0);
                    auVar177._4_4_ = fVar197;
                    auVar177._0_4_ = fVar197;
                    auVar177._8_4_ = fVar197;
                    auVar177._12_4_ = fVar197;
                    auVar83 = vfmadd132ps_fma(auVar177,auVar83,local_4b0);
                    auVar186 = ZEXT1664(auVar83);
                    auVar161._4_4_ = fVar196;
                    auVar161._0_4_ = fVar196;
                    auVar161._8_4_ = fVar196;
                    auVar161._12_4_ = fVar196;
                    (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar65 * 4);
                    auVar83 = vfmadd132ps_fma(auVar161,auVar83,local_4a0);
                    uVar149 = vmovlps_avx(auVar83);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar149;
                    fVar196 = (float)vextractps_avx(auVar83,2);
                    (ray->Ng).field_0.field_0.z = fVar196;
                    ray->u = fVar156;
                    ray->v = fVar195;
                    ray->primID = (uint)local_518;
                    ray->geomID = (uint)local_528;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    lVar63 = local_538;
                  }
                }
              }
            }
          }
        }
        goto LAB_018e20fb;
      }
    }
    fVar156 = (ray->super_RayK<1>).tfar;
    auVar23._4_4_ = fVar156;
    auVar23._0_4_ = fVar156;
    auVar23._8_4_ = fVar156;
    auVar23._12_4_ = fVar156;
    uVar149 = vcmpps_avx512vl(auVar220._0_16_,auVar23,2);
    local_520 = (ulong)((uint)local_520 & (uint)local_520 + 0xf & (uint)uVar149);
  } while( true );
LAB_018e23d9:
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar219 = ZEXT1664(auVar83);
  auVar220 = ZEXT1664(local_450);
  prim = local_510;
  lVar63 = local_538;
LAB_018e20fb:
  lVar61 = lVar61 + 8;
  goto LAB_018e184a;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }